

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# curveNi_intersector.h
# Opt level: O3

bool embree::sse2::CurveNiIntersectorK<4,4>::
     occluded_hn<embree::sse2::OrientedCurve1IntersectorK<embree::HermiteCurveT,4>,embree::sse2::Occluded1KEpilog1<4,true>>
               (Precalculations *pre,RayK<4> *ray,size_t k,RayQueryContext *context,Primitive *prim)

{
  float *pfVar1;
  float *pfVar2;
  float *pfVar3;
  Primitive *pPVar4;
  Primitive PVar5;
  undefined4 uVar6;
  Geometry *pGVar7;
  long lVar8;
  __int_type_conflict _Var9;
  undefined1 auVar10 [12];
  undefined1 auVar11 [12];
  undefined1 auVar12 [12];
  undefined1 auVar13 [12];
  undefined1 auVar14 [12];
  undefined1 auVar15 [12];
  undefined1 auVar16 [12];
  undefined8 uVar17;
  undefined6 uVar18;
  undefined1 auVar19 [12];
  undefined1 auVar20 [12];
  undefined1 auVar21 [12];
  undefined1 auVar22 [12];
  undefined1 auVar23 [12];
  undefined1 auVar24 [12];
  undefined1 auVar25 [12];
  undefined1 auVar26 [12];
  undefined1 auVar27 [12];
  undefined1 auVar28 [12];
  undefined1 auVar29 [12];
  undefined1 auVar30 [12];
  undefined1 auVar31 [12];
  undefined1 auVar32 [12];
  undefined1 auVar33 [12];
  byte bVar34;
  int iVar35;
  ulong uVar36;
  long lVar38;
  RTCFilterFunctionN p_Var39;
  RTCRayN *pRVar40;
  bool bVar41;
  ulong uVar42;
  ulong uVar43;
  bool bVar44;
  uint uVar45;
  uint uVar46;
  int iVar47;
  uint uVar48;
  uint uVar49;
  short sVar50;
  float fVar51;
  float fVar52;
  float fVar91;
  float fVar93;
  vfloat_impl<4> p00;
  undefined2 uVar90;
  undefined1 auVar53 [16];
  undefined1 auVar54 [16];
  undefined1 auVar57 [16];
  float fVar92;
  float fVar94;
  undefined1 auVar60 [16];
  undefined1 auVar61 [16];
  undefined1 auVar64 [16];
  undefined1 auVar67 [16];
  undefined1 auVar70 [16];
  undefined1 auVar73 [16];
  undefined1 auVar74 [16];
  undefined1 auVar75 [16];
  undefined1 auVar76 [16];
  undefined1 auVar77 [16];
  undefined1 auVar78 [16];
  undefined1 auVar79 [16];
  undefined1 auVar80 [16];
  undefined1 auVar81 [16];
  undefined1 auVar82 [16];
  undefined1 auVar83 [16];
  undefined1 auVar84 [16];
  undefined1 auVar85 [16];
  undefined1 auVar87 [16];
  undefined1 auVar88 [16];
  float fVar95;
  float fVar117;
  float fVar118;
  undefined1 auVar96 [16];
  undefined1 auVar99 [16];
  undefined1 auVar100 [16];
  undefined1 auVar101 [16];
  undefined1 auVar102 [16];
  undefined1 auVar103 [16];
  undefined1 auVar104 [16];
  undefined1 auVar105 [16];
  undefined1 auVar106 [16];
  undefined1 auVar107 [16];
  undefined1 auVar108 [16];
  undefined1 auVar109 [16];
  undefined1 auVar110 [16];
  undefined1 auVar111 [16];
  undefined1 auVar112 [16];
  undefined1 auVar113 [16];
  undefined1 auVar114 [16];
  undefined1 auVar115 [16];
  undefined1 auVar116 [16];
  float t1;
  float fVar119;
  float fVar130;
  float fVar131;
  undefined1 auVar120 [16];
  undefined1 auVar121 [16];
  undefined1 auVar122 [16];
  undefined1 auVar123 [16];
  undefined1 auVar124 [16];
  undefined1 auVar125 [16];
  undefined1 auVar126 [16];
  undefined1 auVar127 [16];
  undefined1 auVar128 [16];
  undefined1 auVar129 [16];
  float fVar132;
  float fVar136;
  float fVar137;
  undefined1 auVar133 [16];
  undefined1 auVar134 [16];
  undefined1 auVar135 [16];
  float fVar138;
  float fVar152;
  float fVar153;
  undefined1 auVar139 [16];
  undefined1 auVar140 [16];
  undefined1 auVar141 [16];
  undefined1 auVar142 [16];
  undefined1 auVar143 [16];
  undefined1 auVar144 [16];
  undefined1 auVar145 [16];
  undefined1 auVar146 [16];
  undefined1 auVar147 [16];
  undefined1 auVar148 [16];
  undefined1 auVar149 [16];
  undefined1 auVar150 [16];
  undefined1 auVar151 [16];
  float fVar154;
  float fVar171;
  float fVar172;
  vfloat4 a;
  undefined1 auVar155 [16];
  undefined1 auVar158 [16];
  undefined1 auVar159 [16];
  undefined1 auVar160 [16];
  undefined1 auVar161 [16];
  undefined1 auVar162 [16];
  undefined1 auVar163 [16];
  undefined1 auVar164 [16];
  undefined1 auVar165 [16];
  undefined1 auVar166 [16];
  undefined1 auVar167 [16];
  undefined1 auVar168 [16];
  undefined1 auVar169 [16];
  undefined1 auVar170 [16];
  float fVar173;
  float fVar177;
  float fVar178;
  undefined1 auVar174 [16];
  undefined1 auVar175 [16];
  undefined1 auVar176 [16];
  float fVar179;
  float fVar201;
  float fVar202;
  undefined1 auVar180 [16];
  undefined1 auVar183 [16];
  undefined1 auVar186 [16];
  undefined1 auVar189 [16];
  undefined1 auVar190 [16];
  undefined1 auVar193 [16];
  undefined1 auVar194 [16];
  undefined1 auVar195 [16];
  undefined1 auVar196 [16];
  undefined1 auVar197 [16];
  undefined1 auVar198 [16];
  undefined1 auVar199 [16];
  undefined1 auVar200 [16];
  float fVar203;
  float fVar212;
  float fVar213;
  undefined1 auVar204 [16];
  undefined1 auVar205 [16];
  undefined1 auVar206 [16];
  undefined1 auVar207 [16];
  undefined1 auVar208 [16];
  undefined1 auVar209 [16];
  undefined1 auVar210 [16];
  undefined1 auVar211 [16];
  float fVar214;
  float fVar222;
  float fVar223;
  undefined1 auVar215 [16];
  undefined1 auVar216 [16];
  undefined1 auVar217 [16];
  undefined1 auVar218 [16];
  undefined1 auVar219 [16];
  undefined1 auVar220 [16];
  undefined1 auVar221 [16];
  float fVar224;
  float fVar230;
  float fVar231;
  undefined1 auVar225 [16];
  undefined1 auVar226 [16];
  undefined1 auVar227 [16];
  undefined1 auVar228 [16];
  undefined1 auVar229 [16];
  float fVar232;
  float fVar233;
  float fVar234;
  float fVar243;
  float fVar246;
  vfloat4 a_1;
  undefined1 auVar235 [16];
  float fVar249;
  undefined1 auVar238 [16];
  float fVar244;
  float fVar245;
  float fVar247;
  float fVar248;
  float fVar250;
  float fVar251;
  undefined1 auVar239 [16];
  undefined1 auVar240 [16];
  undefined1 auVar241 [16];
  undefined1 auVar242 [16];
  float fVar252;
  float fVar253;
  float fVar258;
  float fVar260;
  float fVar262;
  undefined1 auVar254 [16];
  float fVar259;
  float fVar261;
  float fVar263;
  undefined1 auVar255 [16];
  undefined1 auVar256 [16];
  undefined1 auVar257 [16];
  float fVar264;
  float fVar265;
  float fVar269;
  float fVar271;
  float fVar272;
  undefined1 auVar266 [16];
  undefined1 auVar267 [16];
  float fVar270;
  undefined1 auVar268 [16];
  float fVar276;
  undefined1 auVar273 [16];
  undefined1 auVar274 [16];
  undefined1 auVar275 [16];
  float fVar278;
  float fVar279;
  undefined1 auVar277 [16];
  vfloat_impl<4> p03;
  vfloat_impl<4> p02;
  vfloat_impl<4> p01;
  vfloat_impl<4> p00_1;
  uint mask_stack [4];
  RTCFilterFunctionNArguments args;
  BBox1f cu_stack [4];
  BBox1f cv_stack [4];
  uint local_53c;
  undefined1 local_528 [8];
  float fStack_520;
  float fStack_51c;
  undefined8 local_4e8;
  float fStack_420;
  float fStack_41c;
  undefined1 local_408 [16];
  undefined1 (*local_3f0) [16];
  ulong local_3e8;
  ulong local_3e0;
  float local_3d8;
  float fStack_3d4;
  float fStack_3d0;
  float fStack_3cc;
  float local_3c8;
  float fStack_3c4;
  float fStack_3c0;
  float fStack_3bc;
  float local_3b8;
  float fStack_3b4;
  float fStack_3b0;
  float fStack_3ac;
  float local_3a8;
  float fStack_3a4;
  float fStack_3a0;
  float fStack_39c;
  float local_398;
  float fStack_394;
  float fStack_390;
  float fStack_38c;
  float local_388;
  float fStack_384;
  float fStack_380;
  float fStack_37c;
  undefined1 local_378 [16];
  float local_368;
  float fStack_364;
  float fStack_360;
  float fStack_35c;
  undefined1 local_358 [16];
  undefined8 local_348;
  float fStack_340;
  float fStack_33c;
  float afStack_338 [4];
  RTCFilterFunctionNArguments local_328;
  uint local_2f8;
  uint uStack_2f4;
  uint uStack_2f0;
  uint uStack_2ec;
  uint local_2e8;
  uint uStack_2e4;
  uint uStack_2e0;
  uint uStack_2dc;
  float local_2d8;
  float fStack_2d4;
  float fStack_2d0;
  float fStack_2cc;
  float local_2c8;
  float fStack_2c4;
  float fStack_2c0;
  float fStack_2bc;
  float local_2b8;
  float fStack_2b4;
  float fStack_2b0;
  float fStack_2ac;
  float local_2a8;
  float fStack_2a4;
  float fStack_2a0;
  float fStack_29c;
  float local_298;
  float fStack_294;
  float fStack_290;
  float fStack_28c;
  float local_288;
  float fStack_284;
  float fStack_280;
  float fStack_27c;
  undefined1 local_278 [16];
  float local_268;
  float fStack_264;
  float fStack_260;
  float fStack_25c;
  float local_258;
  float fStack_254;
  float fStack_250;
  float fStack_24c;
  float local_248;
  float fStack_244;
  float fStack_240;
  float fStack_23c;
  float local_238;
  float fStack_234;
  float fStack_230;
  float fStack_22c;
  undefined1 local_228 [16];
  undefined1 local_218 [16];
  float local_208;
  float fStack_204;
  float fStack_200;
  float fStack_1fc;
  undefined1 local_1f8 [16];
  undefined1 local_1e8 [16];
  undefined1 local_1d8 [16];
  float local_1c8;
  float fStack_1c4;
  float fStack_1c0;
  float fStack_1bc;
  float local_1b8;
  float fStack_1b4;
  float fStack_1b0;
  float fStack_1ac;
  float local_1a8;
  float fStack_1a4;
  float fStack_1a0;
  float fStack_19c;
  float local_198;
  float fStack_194;
  float fStack_190;
  float fStack_18c;
  float local_188;
  float fStack_184;
  float fStack_180;
  float fStack_17c;
  float local_178;
  float fStack_174;
  float fStack_170;
  float fStack_16c;
  float local_168;
  float fStack_164;
  float fStack_160;
  float fStack_15c;
  float local_158;
  float fStack_154;
  float fStack_150;
  float fStack_14c;
  float local_148;
  float fStack_144;
  float fStack_140;
  float fStack_13c;
  float local_138;
  float fStack_134;
  float fStack_130;
  float fStack_12c;
  float local_128;
  float fStack_124;
  float fStack_120;
  float fStack_11c;
  float local_118;
  float fStack_114;
  float fStack_110;
  float fStack_10c;
  float afStack_108 [8];
  float local_e8;
  float fStack_e4;
  float fStack_e0;
  float fStack_dc;
  float local_d8;
  float fStack_d4;
  float fStack_d0;
  float fStack_cc;
  float local_c8;
  float fStack_c4;
  float fStack_c0;
  float fStack_bc;
  float local_b8;
  float fStack_b4;
  float fStack_b0;
  float fStack_ac;
  float local_a8;
  float fStack_a4;
  float fStack_a0;
  float fStack_9c;
  undefined8 local_98;
  undefined8 uStack_90;
  undefined8 local_88;
  undefined8 uStack_80;
  uint local_78;
  uint uStack_74;
  uint uStack_70;
  uint uStack_6c;
  uint local_68;
  uint uStack_64;
  uint uStack_60;
  uint uStack_5c;
  float afStack_58 [10];
  ulong uVar37;
  undefined1 auVar86 [16];
  undefined1 auVar55 [16];
  undefined1 auVar56 [16];
  undefined1 auVar58 [16];
  undefined1 auVar59 [16];
  undefined1 auVar62 [16];
  undefined1 auVar63 [16];
  undefined1 auVar65 [16];
  undefined1 auVar66 [16];
  undefined1 auVar68 [16];
  undefined1 auVar69 [16];
  undefined1 auVar71 [16];
  undefined1 auVar72 [16];
  undefined1 uVar89;
  undefined1 auVar97 [16];
  undefined1 auVar98 [16];
  undefined1 auVar156 [16];
  undefined1 auVar157 [16];
  undefined1 auVar181 [16];
  undefined1 auVar182 [16];
  undefined1 auVar184 [16];
  undefined1 auVar185 [16];
  undefined1 auVar187 [16];
  undefined1 auVar188 [16];
  undefined1 auVar191 [16];
  undefined1 auVar192 [16];
  undefined1 auVar236 [16];
  undefined1 auVar237 [16];
  
  PVar5 = prim[1];
  uVar36 = (ulong)(byte)PVar5;
  pPVar4 = prim + uVar36 * 0x19 + 6;
  fVar131 = *(float *)(pPVar4 + 0xc);
  fVar132 = (*(float *)(ray + k * 4) - *(float *)pPVar4) * fVar131;
  fVar136 = (*(float *)(ray + k * 4 + 0x10) - *(float *)(pPVar4 + 4)) * fVar131;
  fVar137 = (*(float *)(ray + k * 4 + 0x20) - *(float *)(pPVar4 + 8)) * fVar131;
  fVar119 = *(float *)(ray + k * 4 + 0x40) * fVar131;
  fVar130 = *(float *)(ray + k * 4 + 0x50) * fVar131;
  fVar131 = *(float *)(ray + k * 4 + 0x60) * fVar131;
  uVar6 = *(undefined4 *)(prim + uVar36 * 4 + 6);
  uVar89 = (undefined1)((uint)uVar6 >> 0x18);
  uVar90 = CONCAT11(uVar89,uVar89);
  uVar89 = (undefined1)((uint)uVar6 >> 0x10);
  uVar17 = CONCAT35(CONCAT21(uVar90,uVar89),CONCAT14(uVar89,uVar6));
  uVar89 = (undefined1)((uint)uVar6 >> 8);
  uVar18 = CONCAT51(CONCAT41((int)((ulong)uVar17 >> 0x20),uVar89),uVar89);
  sVar50 = CONCAT11((char)uVar6,(char)uVar6);
  uVar37 = CONCAT62(uVar18,sVar50);
  auVar161._8_4_ = 0;
  auVar161._0_8_ = uVar37;
  auVar161._12_2_ = uVar90;
  auVar161._14_2_ = uVar90;
  uVar90 = (undefined2)((ulong)uVar17 >> 0x20);
  auVar160._12_4_ = auVar161._12_4_;
  auVar160._8_2_ = 0;
  auVar160._0_8_ = uVar37;
  auVar160._10_2_ = uVar90;
  auVar60._10_6_ = auVar160._10_6_;
  auVar60._8_2_ = uVar90;
  auVar60._0_8_ = uVar37;
  uVar90 = (undefined2)uVar18;
  auVar19._4_8_ = auVar60._8_8_;
  auVar19._2_2_ = uVar90;
  auVar19._0_2_ = uVar90;
  fVar95 = (float)((int)sVar50 >> 8);
  fVar117 = (float)(auVar19._0_4_ >> 0x18);
  fVar118 = (float)(auVar60._8_4_ >> 0x18);
  uVar6 = *(undefined4 *)(prim + uVar36 * 5 + 6);
  uVar89 = (undefined1)((uint)uVar6 >> 0x18);
  uVar90 = CONCAT11(uVar89,uVar89);
  uVar89 = (undefined1)((uint)uVar6 >> 0x10);
  uVar17 = CONCAT35(CONCAT21(uVar90,uVar89),CONCAT14(uVar89,uVar6));
  uVar89 = (undefined1)((uint)uVar6 >> 8);
  uVar18 = CONCAT51(CONCAT41((int)((ulong)uVar17 >> 0x20),uVar89),uVar89);
  sVar50 = CONCAT11((char)uVar6,(char)uVar6);
  uVar37 = CONCAT62(uVar18,sVar50);
  auVar53._8_4_ = 0;
  auVar53._0_8_ = uVar37;
  auVar53._12_2_ = uVar90;
  auVar53._14_2_ = uVar90;
  uVar90 = (undefined2)((ulong)uVar17 >> 0x20);
  auVar216._12_4_ = auVar53._12_4_;
  auVar216._8_2_ = 0;
  auVar216._0_8_ = uVar37;
  auVar216._10_2_ = uVar90;
  auVar123._10_6_ = auVar216._10_6_;
  auVar123._8_2_ = uVar90;
  auVar123._0_8_ = uVar37;
  uVar90 = (undefined2)uVar18;
  auVar20._4_8_ = auVar123._8_8_;
  auVar20._2_2_ = uVar90;
  auVar20._0_2_ = uVar90;
  fVar138 = (float)((int)sVar50 >> 8);
  fVar152 = (float)(auVar20._0_4_ >> 0x18);
  fVar153 = (float)(auVar123._8_4_ >> 0x18);
  uVar6 = *(undefined4 *)(prim + uVar36 * 6 + 6);
  uVar89 = (undefined1)((uint)uVar6 >> 0x18);
  uVar90 = CONCAT11(uVar89,uVar89);
  uVar89 = (undefined1)((uint)uVar6 >> 0x10);
  uVar17 = CONCAT35(CONCAT21(uVar90,uVar89),CONCAT14(uVar89,uVar6));
  uVar89 = (undefined1)((uint)uVar6 >> 8);
  uVar18 = CONCAT51(CONCAT41((int)((ulong)uVar17 >> 0x20),uVar89),uVar89);
  sVar50 = CONCAT11((char)uVar6,(char)uVar6);
  uVar37 = CONCAT62(uVar18,sVar50);
  auVar56._8_4_ = 0;
  auVar56._0_8_ = uVar37;
  auVar56._12_2_ = uVar90;
  auVar56._14_2_ = uVar90;
  uVar90 = (undefined2)((ulong)uVar17 >> 0x20);
  auVar55._12_4_ = auVar56._12_4_;
  auVar55._8_2_ = 0;
  auVar55._0_8_ = uVar37;
  auVar55._10_2_ = uVar90;
  auVar54._10_6_ = auVar55._10_6_;
  auVar54._8_2_ = uVar90;
  auVar54._0_8_ = uVar37;
  uVar90 = (undefined2)uVar18;
  auVar21._4_8_ = auVar54._8_8_;
  auVar21._2_2_ = uVar90;
  auVar21._0_2_ = uVar90;
  fVar173 = (float)((int)sVar50 >> 8);
  fVar177 = (float)(auVar21._0_4_ >> 0x18);
  fVar178 = (float)(auVar54._8_4_ >> 0x18);
  uVar6 = *(undefined4 *)(prim + uVar36 * 0xb + 6);
  uVar89 = (undefined1)((uint)uVar6 >> 0x18);
  uVar90 = CONCAT11(uVar89,uVar89);
  uVar89 = (undefined1)((uint)uVar6 >> 0x10);
  uVar17 = CONCAT35(CONCAT21(uVar90,uVar89),CONCAT14(uVar89,uVar6));
  uVar89 = (undefined1)((uint)uVar6 >> 8);
  uVar18 = CONCAT51(CONCAT41((int)((ulong)uVar17 >> 0x20),uVar89),uVar89);
  sVar50 = CONCAT11((char)uVar6,(char)uVar6);
  uVar37 = CONCAT62(uVar18,sVar50);
  auVar59._8_4_ = 0;
  auVar59._0_8_ = uVar37;
  auVar59._12_2_ = uVar90;
  auVar59._14_2_ = uVar90;
  uVar90 = (undefined2)((ulong)uVar17 >> 0x20);
  auVar58._12_4_ = auVar59._12_4_;
  auVar58._8_2_ = 0;
  auVar58._0_8_ = uVar37;
  auVar58._10_2_ = uVar90;
  auVar57._10_6_ = auVar58._10_6_;
  auVar57._8_2_ = uVar90;
  auVar57._0_8_ = uVar37;
  uVar90 = (undefined2)uVar18;
  auVar22._4_8_ = auVar57._8_8_;
  auVar22._2_2_ = uVar90;
  auVar22._0_2_ = uVar90;
  fVar51 = (float)((int)sVar50 >> 8);
  fVar91 = (float)(auVar22._0_4_ >> 0x18);
  fVar93 = (float)(auVar57._8_4_ >> 0x18);
  uVar6 = *(undefined4 *)(prim + (ulong)((uint)(byte)PVar5 * 0xc) + 6);
  uVar89 = (undefined1)((uint)uVar6 >> 0x18);
  uVar90 = CONCAT11(uVar89,uVar89);
  uVar89 = (undefined1)((uint)uVar6 >> 0x10);
  uVar17 = CONCAT35(CONCAT21(uVar90,uVar89),CONCAT14(uVar89,uVar6));
  uVar89 = (undefined1)((uint)uVar6 >> 8);
  uVar18 = CONCAT51(CONCAT41((int)((ulong)uVar17 >> 0x20),uVar89),uVar89);
  sVar50 = CONCAT11((char)uVar6,(char)uVar6);
  uVar37 = CONCAT62(uVar18,sVar50);
  auVar157._8_4_ = 0;
  auVar157._0_8_ = uVar37;
  auVar157._12_2_ = uVar90;
  auVar157._14_2_ = uVar90;
  uVar90 = (undefined2)((ulong)uVar17 >> 0x20);
  auVar156._12_4_ = auVar157._12_4_;
  auVar156._8_2_ = 0;
  auVar156._0_8_ = uVar37;
  auVar156._10_2_ = uVar90;
  auVar155._10_6_ = auVar156._10_6_;
  auVar155._8_2_ = uVar90;
  auVar155._0_8_ = uVar37;
  uVar90 = (undefined2)uVar18;
  auVar23._4_8_ = auVar155._8_8_;
  auVar23._2_2_ = uVar90;
  auVar23._0_2_ = uVar90;
  fVar154 = (float)((int)sVar50 >> 8);
  fVar171 = (float)(auVar23._0_4_ >> 0x18);
  fVar172 = (float)(auVar155._8_4_ >> 0x18);
  uVar6 = *(undefined4 *)(prim + (uint)(byte)PVar5 * 0xc + uVar36 + 6);
  uVar89 = (undefined1)((uint)uVar6 >> 0x18);
  uVar90 = CONCAT11(uVar89,uVar89);
  uVar89 = (undefined1)((uint)uVar6 >> 0x10);
  uVar17 = CONCAT35(CONCAT21(uVar90,uVar89),CONCAT14(uVar89,uVar6));
  uVar89 = (undefined1)((uint)uVar6 >> 8);
  uVar18 = CONCAT51(CONCAT41((int)((ulong)uVar17 >> 0x20),uVar89),uVar89);
  sVar50 = CONCAT11((char)uVar6,(char)uVar6);
  uVar37 = CONCAT62(uVar18,sVar50);
  auVar182._8_4_ = 0;
  auVar182._0_8_ = uVar37;
  auVar182._12_2_ = uVar90;
  auVar182._14_2_ = uVar90;
  uVar90 = (undefined2)((ulong)uVar17 >> 0x20);
  auVar181._12_4_ = auVar182._12_4_;
  auVar181._8_2_ = 0;
  auVar181._0_8_ = uVar37;
  auVar181._10_2_ = uVar90;
  auVar180._10_6_ = auVar181._10_6_;
  auVar180._8_2_ = uVar90;
  auVar180._0_8_ = uVar37;
  uVar90 = (undefined2)uVar18;
  auVar24._4_8_ = auVar180._8_8_;
  auVar24._2_2_ = uVar90;
  auVar24._0_2_ = uVar90;
  fVar214 = (float)((int)sVar50 >> 8);
  fVar222 = (float)(auVar24._0_4_ >> 0x18);
  fVar223 = (float)(auVar180._8_4_ >> 0x18);
  uVar43 = (ulong)(uint)((int)(uVar36 * 9) * 2);
  uVar6 = *(undefined4 *)(prim + uVar43 + 6);
  uVar89 = (undefined1)((uint)uVar6 >> 0x18);
  uVar90 = CONCAT11(uVar89,uVar89);
  uVar89 = (undefined1)((uint)uVar6 >> 0x10);
  uVar17 = CONCAT35(CONCAT21(uVar90,uVar89),CONCAT14(uVar89,uVar6));
  uVar89 = (undefined1)((uint)uVar6 >> 8);
  uVar18 = CONCAT51(CONCAT41((int)((ulong)uVar17 >> 0x20),uVar89),uVar89);
  sVar50 = CONCAT11((char)uVar6,(char)uVar6);
  uVar37 = CONCAT62(uVar18,sVar50);
  auVar185._8_4_ = 0;
  auVar185._0_8_ = uVar37;
  auVar185._12_2_ = uVar90;
  auVar185._14_2_ = uVar90;
  uVar90 = (undefined2)((ulong)uVar17 >> 0x20);
  auVar184._12_4_ = auVar185._12_4_;
  auVar184._8_2_ = 0;
  auVar184._0_8_ = uVar37;
  auVar184._10_2_ = uVar90;
  auVar183._10_6_ = auVar184._10_6_;
  auVar183._8_2_ = uVar90;
  auVar183._0_8_ = uVar37;
  uVar90 = (undefined2)uVar18;
  auVar25._4_8_ = auVar183._8_8_;
  auVar25._2_2_ = uVar90;
  auVar25._0_2_ = uVar90;
  fVar203 = (float)((int)sVar50 >> 8);
  fVar212 = (float)(auVar25._0_4_ >> 0x18);
  fVar213 = (float)(auVar183._8_4_ >> 0x18);
  uVar6 = *(undefined4 *)(prim + uVar43 + uVar36 + 6);
  uVar89 = (undefined1)((uint)uVar6 >> 0x18);
  uVar90 = CONCAT11(uVar89,uVar89);
  uVar89 = (undefined1)((uint)uVar6 >> 0x10);
  uVar17 = CONCAT35(CONCAT21(uVar90,uVar89),CONCAT14(uVar89,uVar6));
  uVar89 = (undefined1)((uint)uVar6 >> 8);
  uVar18 = CONCAT51(CONCAT41((int)((ulong)uVar17 >> 0x20),uVar89),uVar89);
  sVar50 = CONCAT11((char)uVar6,(char)uVar6);
  uVar37 = CONCAT62(uVar18,sVar50);
  auVar188._8_4_ = 0;
  auVar188._0_8_ = uVar37;
  auVar188._12_2_ = uVar90;
  auVar188._14_2_ = uVar90;
  uVar90 = (undefined2)((ulong)uVar17 >> 0x20);
  auVar187._12_4_ = auVar188._12_4_;
  auVar187._8_2_ = 0;
  auVar187._0_8_ = uVar37;
  auVar187._10_2_ = uVar90;
  auVar186._10_6_ = auVar187._10_6_;
  auVar186._8_2_ = uVar90;
  auVar186._0_8_ = uVar37;
  uVar90 = (undefined2)uVar18;
  auVar26._4_8_ = auVar186._8_8_;
  auVar26._2_2_ = uVar90;
  auVar26._0_2_ = uVar90;
  fVar224 = (float)((int)sVar50 >> 8);
  fVar230 = (float)(auVar26._0_4_ >> 0x18);
  fVar231 = (float)(auVar186._8_4_ >> 0x18);
  uVar42 = (ulong)(uint)((int)(uVar36 * 5) << 2);
  uVar6 = *(undefined4 *)(prim + uVar42 + 6);
  uVar89 = (undefined1)((uint)uVar6 >> 0x18);
  uVar90 = CONCAT11(uVar89,uVar89);
  uVar89 = (undefined1)((uint)uVar6 >> 0x10);
  uVar17 = CONCAT35(CONCAT21(uVar90,uVar89),CONCAT14(uVar89,uVar6));
  uVar89 = (undefined1)((uint)uVar6 >> 8);
  uVar18 = CONCAT51(CONCAT41((int)((ulong)uVar17 >> 0x20),uVar89),uVar89);
  sVar50 = CONCAT11((char)uVar6,(char)uVar6);
  uVar37 = CONCAT62(uVar18,sVar50);
  auVar237._8_4_ = 0;
  auVar237._0_8_ = uVar37;
  auVar237._12_2_ = uVar90;
  auVar237._14_2_ = uVar90;
  uVar90 = (undefined2)((ulong)uVar17 >> 0x20);
  auVar236._12_4_ = auVar237._12_4_;
  auVar236._8_2_ = 0;
  auVar236._0_8_ = uVar37;
  auVar236._10_2_ = uVar90;
  auVar235._10_6_ = auVar236._10_6_;
  auVar235._8_2_ = uVar90;
  auVar235._0_8_ = uVar37;
  uVar90 = (undefined2)uVar18;
  auVar27._4_8_ = auVar235._8_8_;
  auVar27._2_2_ = uVar90;
  auVar27._0_2_ = uVar90;
  fVar52 = (float)((int)sVar50 >> 8);
  fVar92 = (float)(auVar27._0_4_ >> 0x18);
  fVar94 = (float)(auVar235._8_4_ >> 0x18);
  fVar252 = fVar119 * fVar95 + fVar130 * fVar138 + fVar131 * fVar173;
  fVar258 = fVar119 * fVar117 + fVar130 * fVar152 + fVar131 * fVar177;
  fVar260 = fVar119 * fVar118 + fVar130 * fVar153 + fVar131 * fVar178;
  fVar262 = fVar119 * (float)(auVar160._12_4_ >> 0x18) +
            fVar130 * (float)(auVar216._12_4_ >> 0x18) + fVar131 * (float)(auVar55._12_4_ >> 0x18);
  fVar232 = fVar119 * fVar51 + fVar130 * fVar154 + fVar131 * fVar214;
  fVar243 = fVar119 * fVar91 + fVar130 * fVar171 + fVar131 * fVar222;
  fVar246 = fVar119 * fVar93 + fVar130 * fVar172 + fVar131 * fVar223;
  fVar249 = fVar119 * (float)(auVar58._12_4_ >> 0x18) +
            fVar130 * (float)(auVar156._12_4_ >> 0x18) + fVar131 * (float)(auVar181._12_4_ >> 0x18);
  fVar179 = fVar119 * fVar203 + fVar130 * fVar224 + fVar131 * fVar52;
  fVar201 = fVar119 * fVar212 + fVar130 * fVar230 + fVar131 * fVar92;
  fVar202 = fVar119 * fVar213 + fVar130 * fVar231 + fVar131 * fVar94;
  fVar119 = fVar119 * (float)(auVar184._12_4_ >> 0x18) +
            fVar130 * (float)(auVar187._12_4_ >> 0x18) + fVar131 * (float)(auVar236._12_4_ >> 0x18);
  uVar6 = *(undefined4 *)(ray + k * 4 + 0x30);
  fVar138 = fVar95 * fVar132 + fVar138 * fVar136 + fVar173 * fVar137;
  fVar152 = fVar117 * fVar132 + fVar152 * fVar136 + fVar177 * fVar137;
  fVar153 = fVar118 * fVar132 + fVar153 * fVar136 + fVar178 * fVar137;
  fVar173 = (float)(auVar160._12_4_ >> 0x18) * fVar132 +
            (float)(auVar216._12_4_ >> 0x18) * fVar136 + (float)(auVar55._12_4_ >> 0x18) * fVar137;
  fVar177 = fVar51 * fVar132 + fVar154 * fVar136 + fVar214 * fVar137;
  fVar178 = fVar91 * fVar132 + fVar171 * fVar136 + fVar222 * fVar137;
  fVar214 = fVar93 * fVar132 + fVar172 * fVar136 + fVar223 * fVar137;
  fVar222 = (float)(auVar58._12_4_ >> 0x18) * fVar132 +
            (float)(auVar156._12_4_ >> 0x18) * fVar136 + (float)(auVar181._12_4_ >> 0x18) * fVar137;
  fVar154 = fVar132 * fVar203 + fVar136 * fVar224 + fVar137 * fVar52;
  fVar171 = fVar132 * fVar212 + fVar136 * fVar230 + fVar137 * fVar92;
  fVar172 = fVar132 * fVar213 + fVar136 * fVar231 + fVar137 * fVar94;
  fVar132 = fVar132 * (float)(auVar184._12_4_ >> 0x18) +
            fVar136 * (float)(auVar187._12_4_ >> 0x18) + fVar137 * (float)(auVar236._12_4_ >> 0x18);
  fVar131 = (float)DAT_01f80d30;
  fVar51 = DAT_01f80d30._4_4_;
  fVar52 = DAT_01f80d30._8_4_;
  fVar91 = DAT_01f80d30._12_4_;
  uVar45 = -(uint)(fVar131 <= ABS(fVar252));
  uVar46 = -(uint)(fVar51 <= ABS(fVar258));
  uVar48 = -(uint)(fVar52 <= ABS(fVar260));
  uVar49 = -(uint)(fVar91 <= ABS(fVar262));
  auVar254._0_4_ = (uint)fVar252 & uVar45;
  auVar254._4_4_ = (uint)fVar258 & uVar46;
  auVar254._8_4_ = (uint)fVar260 & uVar48;
  auVar254._12_4_ = (uint)fVar262 & uVar49;
  auVar139._0_4_ = ~uVar45 & (uint)fVar131;
  auVar139._4_4_ = ~uVar46 & (uint)fVar51;
  auVar139._8_4_ = ~uVar48 & (uint)fVar52;
  auVar139._12_4_ = ~uVar49 & (uint)fVar91;
  auVar139 = auVar139 | auVar254;
  uVar45 = -(uint)(fVar131 <= ABS(fVar232));
  uVar46 = -(uint)(fVar51 <= ABS(fVar243));
  uVar48 = -(uint)(fVar52 <= ABS(fVar246));
  uVar49 = -(uint)(fVar91 <= ABS(fVar249));
  auVar238._0_4_ = (uint)fVar232 & uVar45;
  auVar238._4_4_ = (uint)fVar243 & uVar46;
  auVar238._8_4_ = (uint)fVar246 & uVar48;
  auVar238._12_4_ = (uint)fVar249 & uVar49;
  auVar158._0_4_ = ~uVar45 & (uint)fVar131;
  auVar158._4_4_ = ~uVar46 & (uint)fVar51;
  auVar158._8_4_ = ~uVar48 & (uint)fVar52;
  auVar158._12_4_ = ~uVar49 & (uint)fVar91;
  auVar158 = auVar158 | auVar238;
  uVar45 = -(uint)(fVar131 <= ABS(fVar179));
  uVar46 = -(uint)(fVar51 <= ABS(fVar201));
  uVar48 = -(uint)(fVar52 <= ABS(fVar202));
  uVar49 = -(uint)(fVar91 <= ABS(fVar119));
  auVar189._0_4_ = (uint)fVar179 & uVar45;
  auVar189._4_4_ = (uint)fVar201 & uVar46;
  auVar189._8_4_ = (uint)fVar202 & uVar48;
  auVar189._12_4_ = (uint)fVar119 & uVar49;
  auVar174._0_4_ = ~uVar45 & (uint)fVar131;
  auVar174._4_4_ = ~uVar46 & (uint)fVar51;
  auVar174._8_4_ = ~uVar48 & (uint)fVar52;
  auVar174._12_4_ = ~uVar49 & (uint)fVar91;
  auVar174 = auVar174 | auVar189;
  auVar60 = rcpps(_DAT_01f80d30,auVar139);
  fVar131 = auVar60._0_4_;
  fVar91 = auVar60._4_4_;
  fVar94 = auVar60._8_4_;
  fVar118 = auVar60._12_4_;
  fVar131 = (1.0 - auVar139._0_4_ * fVar131) * fVar131 + fVar131;
  fVar91 = (1.0 - auVar139._4_4_ * fVar91) * fVar91 + fVar91;
  fVar94 = (1.0 - auVar139._8_4_ * fVar94) * fVar94 + fVar94;
  fVar118 = (1.0 - auVar139._12_4_ * fVar118) * fVar118 + fVar118;
  auVar60 = rcpps(auVar60,auVar158);
  fVar51 = auVar60._0_4_;
  fVar92 = auVar60._4_4_;
  fVar95 = auVar60._8_4_;
  fVar119 = auVar60._12_4_;
  fVar51 = (1.0 - auVar158._0_4_ * fVar51) * fVar51 + fVar51;
  fVar92 = (1.0 - auVar158._4_4_ * fVar92) * fVar92 + fVar92;
  fVar95 = (1.0 - auVar158._8_4_ * fVar95) * fVar95 + fVar95;
  fVar119 = (1.0 - auVar158._12_4_ * fVar119) * fVar119 + fVar119;
  auVar60 = rcpps(auVar60,auVar174);
  fVar52 = auVar60._0_4_;
  fVar93 = auVar60._4_4_;
  fVar117 = auVar60._8_4_;
  fVar130 = auVar60._12_4_;
  fVar52 = (1.0 - auVar174._0_4_ * fVar52) * fVar52 + fVar52;
  fVar93 = (1.0 - auVar174._4_4_ * fVar93) * fVar93 + fVar93;
  fVar117 = (1.0 - auVar174._8_4_ * fVar117) * fVar117 + fVar117;
  fVar130 = (1.0 - auVar174._12_4_ * fVar130) * fVar130 + fVar130;
  uVar37 = *(ulong *)(prim + uVar36 * 7 + 6);
  uVar90 = (undefined2)(uVar37 >> 0x30);
  auVar63._8_4_ = 0;
  auVar63._0_8_ = uVar37;
  auVar63._12_2_ = uVar90;
  auVar63._14_2_ = uVar90;
  uVar90 = (undefined2)(uVar37 >> 0x20);
  auVar62._12_4_ = auVar63._12_4_;
  auVar62._8_2_ = 0;
  auVar62._0_8_ = uVar37;
  auVar62._10_2_ = uVar90;
  auVar61._10_6_ = auVar62._10_6_;
  auVar61._8_2_ = uVar90;
  auVar61._0_8_ = uVar37;
  uVar90 = (undefined2)(uVar37 >> 0x10);
  auVar28._4_8_ = auVar61._8_8_;
  auVar28._2_2_ = uVar90;
  auVar28._0_2_ = uVar90;
  auVar140._0_8_ =
       CONCAT44(((float)(auVar28._0_4_ >> 0x10) - fVar152) * fVar91,
                ((float)(int)(short)uVar37 - fVar138) * fVar131);
  auVar140._8_4_ = ((float)(auVar61._8_4_ >> 0x10) - fVar153) * fVar94;
  auVar140._12_4_ = ((float)(auVar62._12_4_ >> 0x10) - fVar173) * fVar118;
  uVar37 = *(ulong *)(prim + uVar36 * 9 + 6);
  uVar90 = (undefined2)(uVar37 >> 0x30);
  auVar66._8_4_ = 0;
  auVar66._0_8_ = uVar37;
  auVar66._12_2_ = uVar90;
  auVar66._14_2_ = uVar90;
  uVar90 = (undefined2)(uVar37 >> 0x20);
  auVar65._12_4_ = auVar66._12_4_;
  auVar65._8_2_ = 0;
  auVar65._0_8_ = uVar37;
  auVar65._10_2_ = uVar90;
  auVar64._10_6_ = auVar65._10_6_;
  auVar64._8_2_ = uVar90;
  auVar64._0_8_ = uVar37;
  uVar90 = (undefined2)(uVar37 >> 0x10);
  auVar29._4_8_ = auVar64._8_8_;
  auVar29._2_2_ = uVar90;
  auVar29._0_2_ = uVar90;
  auVar175._0_4_ = ((float)(int)(short)uVar37 - fVar138) * fVar131;
  auVar175._4_4_ = ((float)(auVar29._0_4_ >> 0x10) - fVar152) * fVar91;
  auVar175._8_4_ = ((float)(auVar64._8_4_ >> 0x10) - fVar153) * fVar94;
  auVar175._12_4_ = ((float)(auVar65._12_4_ >> 0x10) - fVar173) * fVar118;
  uVar37 = *(ulong *)(prim + (ulong)(byte)PVar5 * 0x10 + 6);
  uVar43 = *(ulong *)(prim + (ulong)(byte)PVar5 * 0x10 + uVar36 * -2 + 6);
  uVar90 = (undefined2)(uVar43 >> 0x30);
  auVar98._8_4_ = 0;
  auVar98._0_8_ = uVar43;
  auVar98._12_2_ = uVar90;
  auVar98._14_2_ = uVar90;
  uVar90 = (undefined2)(uVar43 >> 0x20);
  auVar97._12_4_ = auVar98._12_4_;
  auVar97._8_2_ = 0;
  auVar97._0_8_ = uVar43;
  auVar97._10_2_ = uVar90;
  auVar96._10_6_ = auVar97._10_6_;
  auVar96._8_2_ = uVar90;
  auVar96._0_8_ = uVar43;
  uVar90 = (undefined2)(uVar43 >> 0x10);
  auVar30._4_8_ = auVar96._8_8_;
  auVar30._2_2_ = uVar90;
  auVar30._0_2_ = uVar90;
  auVar99._0_8_ =
       CONCAT44(((float)(auVar30._0_4_ >> 0x10) - fVar178) * fVar92,
                ((float)(int)(short)uVar43 - fVar177) * fVar51);
  auVar99._8_4_ = ((float)(auVar96._8_4_ >> 0x10) - fVar214) * fVar95;
  auVar99._12_4_ = ((float)(auVar97._12_4_ >> 0x10) - fVar222) * fVar119;
  uVar90 = (undefined2)(uVar37 >> 0x30);
  auVar69._8_4_ = 0;
  auVar69._0_8_ = uVar37;
  auVar69._12_2_ = uVar90;
  auVar69._14_2_ = uVar90;
  uVar90 = (undefined2)(uVar37 >> 0x20);
  auVar68._12_4_ = auVar69._12_4_;
  auVar68._8_2_ = 0;
  auVar68._0_8_ = uVar37;
  auVar68._10_2_ = uVar90;
  auVar67._10_6_ = auVar68._10_6_;
  auVar67._8_2_ = uVar90;
  auVar67._0_8_ = uVar37;
  uVar90 = (undefined2)(uVar37 >> 0x10);
  auVar31._4_8_ = auVar67._8_8_;
  auVar31._2_2_ = uVar90;
  auVar31._0_2_ = uVar90;
  auVar204._0_4_ = ((float)(int)(short)uVar37 - fVar177) * fVar51;
  auVar204._4_4_ = ((float)(auVar31._0_4_ >> 0x10) - fVar178) * fVar92;
  auVar204._8_4_ = ((float)(auVar67._8_4_ >> 0x10) - fVar214) * fVar95;
  auVar204._12_4_ = ((float)(auVar68._12_4_ >> 0x10) - fVar222) * fVar119;
  uVar37 = *(ulong *)(prim + uVar42 + uVar36 + 6);
  uVar90 = (undefined2)(uVar37 >> 0x30);
  auVar72._8_4_ = 0;
  auVar72._0_8_ = uVar37;
  auVar72._12_2_ = uVar90;
  auVar72._14_2_ = uVar90;
  uVar90 = (undefined2)(uVar37 >> 0x20);
  auVar71._12_4_ = auVar72._12_4_;
  auVar71._8_2_ = 0;
  auVar71._0_8_ = uVar37;
  auVar71._10_2_ = uVar90;
  auVar70._10_6_ = auVar71._10_6_;
  auVar70._8_2_ = uVar90;
  auVar70._0_8_ = uVar37;
  uVar90 = (undefined2)(uVar37 >> 0x10);
  auVar32._4_8_ = auVar70._8_8_;
  auVar32._2_2_ = uVar90;
  auVar32._0_2_ = uVar90;
  auVar73._0_8_ =
       CONCAT44(((float)(auVar32._0_4_ >> 0x10) - fVar171) * fVar93,
                ((float)(int)(short)uVar37 - fVar154) * fVar52);
  auVar73._8_4_ = ((float)(auVar70._8_4_ >> 0x10) - fVar172) * fVar117;
  auVar73._12_4_ = ((float)(auVar71._12_4_ >> 0x10) - fVar132) * fVar130;
  uVar37 = *(ulong *)(prim + uVar36 * 0x17 + 6);
  uVar90 = (undefined2)(uVar37 >> 0x30);
  auVar192._8_4_ = 0;
  auVar192._0_8_ = uVar37;
  auVar192._12_2_ = uVar90;
  auVar192._14_2_ = uVar90;
  uVar90 = (undefined2)(uVar37 >> 0x20);
  auVar191._12_4_ = auVar192._12_4_;
  auVar191._8_2_ = 0;
  auVar191._0_8_ = uVar37;
  auVar191._10_2_ = uVar90;
  auVar190._10_6_ = auVar191._10_6_;
  auVar190._8_2_ = uVar90;
  auVar190._0_8_ = uVar37;
  uVar90 = (undefined2)(uVar37 >> 0x10);
  auVar33._4_8_ = auVar190._8_8_;
  auVar33._2_2_ = uVar90;
  auVar33._0_2_ = uVar90;
  auVar193._0_4_ = ((float)(int)(short)uVar37 - fVar154) * fVar52;
  auVar193._4_4_ = ((float)(auVar33._0_4_ >> 0x10) - fVar171) * fVar93;
  auVar193._8_4_ = ((float)(auVar190._8_4_ >> 0x10) - fVar172) * fVar117;
  auVar193._12_4_ = ((float)(auVar191._12_4_ >> 0x10) - fVar132) * fVar130;
  auVar159._8_4_ = auVar140._8_4_;
  auVar159._0_8_ = auVar140._0_8_;
  auVar159._12_4_ = auVar140._12_4_;
  auVar160 = minps(auVar159,auVar175);
  auVar120._8_4_ = auVar99._8_4_;
  auVar120._0_8_ = auVar99._0_8_;
  auVar120._12_4_ = auVar99._12_4_;
  auVar60 = minps(auVar120,auVar204);
  auVar160 = maxps(auVar160,auVar60);
  auVar121._8_4_ = auVar73._8_4_;
  auVar121._0_8_ = auVar73._0_8_;
  auVar121._12_4_ = auVar73._12_4_;
  auVar60 = minps(auVar121,auVar193);
  auVar133._4_4_ = uVar6;
  auVar133._0_4_ = uVar6;
  auVar133._8_4_ = uVar6;
  auVar133._12_4_ = uVar6;
  auVar60 = maxps(auVar60,auVar133);
  auVar161 = maxps(auVar160,auVar60);
  auVar160 = maxps(auVar140,auVar175);
  auVar60 = maxps(auVar99,auVar204);
  auVar160 = minps(auVar160,auVar60);
  local_298 = auVar161._0_4_ * 0.99999964;
  fStack_294 = auVar161._4_4_ * 0.99999964;
  fStack_290 = auVar161._8_4_ * 0.99999964;
  fStack_28c = auVar161._12_4_ * 0.99999964;
  auVar60 = maxps(auVar73,auVar193);
  uVar6 = *(undefined4 *)(ray + k * 4 + 0x80);
  auVar100._4_4_ = uVar6;
  auVar100._0_4_ = uVar6;
  auVar100._8_4_ = uVar6;
  auVar100._12_4_ = uVar6;
  auVar60 = minps(auVar60,auVar100);
  auVar60 = minps(auVar160,auVar60);
  auVar101._0_4_ = -(uint)(PVar5 != (Primitive)0x0 && local_298 <= auVar60._0_4_ * 1.0000004);
  auVar101._4_4_ = -(uint)(1 < (byte)PVar5 && fStack_294 <= auVar60._4_4_ * 1.0000004);
  auVar101._8_4_ = -(uint)(2 < (byte)PVar5 && fStack_290 <= auVar60._8_4_ * 1.0000004);
  auVar101._12_4_ = -(uint)(3 < (byte)PVar5 && fStack_28c <= auVar60._12_4_ * 1.0000004);
  uVar45 = movmskps((uint)(byte)PVar5,auVar101);
  if (uVar45 == 0) {
    return false;
  }
  uVar45 = uVar45 & 0xff;
  local_3f0 = (undefined1 (*) [16])(mm_lookupmask_ps + (long)(1 << ((byte)k & 0x1f)) * 0x10);
  local_278._0_4_ = -(uint)((int)mm_lookupmask_ps._240_4_ < 0);
  local_278._4_4_ = -(uint)((int)mm_lookupmask_ps._244_4_ < 0);
  local_278._8_4_ = -(uint)((int)mm_lookupmask_ps._248_4_ < 0);
  local_278._12_4_ = 0;
LAB_00a74d1d:
  lVar38 = 0;
  if ((ulong)uVar45 != 0) {
    for (; (uVar45 >> lVar38 & 1) == 0; lVar38 = lVar38 + 1) {
    }
  }
  local_2e8 = *(uint *)(prim + 2);
  local_3e8 = (ulong)local_2e8;
  local_2f8 = *(uint *)(prim + lVar38 * 4 + 6);
  uVar37 = (ulong)local_2f8;
  pGVar7 = (context->scene->geometries).items[local_3e8].ptr;
  lVar8 = *(long *)&pGVar7[1].time_range.upper;
  uVar43 = (ulong)*(uint *)(*(long *)&pGVar7->field_0x58 +
                           uVar37 * pGVar7[1].super_RefCount.refCounter.
                                    super___atomic_base<unsigned_long>._M_i);
  pfVar1 = (float *)(lVar8 + (long)pGVar7[1].intersectionFilterN * uVar43);
  fVar131 = *pfVar1;
  fVar51 = pfVar1[1];
  fVar52 = pfVar1[2];
  fVar91 = pfVar1[3];
  lVar38 = uVar43 + 1;
  pfVar1 = (float *)(lVar8 + (long)pGVar7[1].intersectionFilterN * lVar38);
  fVar92 = *pfVar1;
  fVar93 = pfVar1[1];
  fVar94 = pfVar1[2];
  fVar95 = pfVar1[3];
  _Var9 = pGVar7[2].super_RefCount.refCounter.super___atomic_base<unsigned_long>._M_i;
  pfVar1 = (float *)(_Var9 + (long)pGVar7[2].userPtr * uVar43);
  fVar117 = *pfVar1;
  fVar118 = pfVar1[1];
  fVar119 = pfVar1[2];
  fVar130 = pfVar1[3];
  pfVar1 = (float *)(_Var9 + (long)pGVar7[2].userPtr * lVar38);
  fVar138 = *pfVar1;
  fVar152 = pfVar1[1];
  fVar153 = pfVar1[2];
  fVar173 = pfVar1[3];
  pfVar1 = (float *)((long)pGVar7[3].userPtr + uVar43 * *(long *)&pGVar7[3].fnumTimeSegments);
  pfVar2 = (float *)((long)pGVar7[3].userPtr + *(long *)&pGVar7[3].fnumTimeSegments * lVar38);
  pfVar3 = (float *)(pGVar7[2].intersectionFilterN + (long)pGVar7[2].pointQueryFunc * uVar43);
  local_1c8 = *(float *)(ray + k * 4);
  fStack_1c4 = *(float *)(ray + k * 4 + 0x10);
  fStack_1c0 = *(float *)(ray + k * 4 + 0x20);
  fVar154 = *pfVar3 * 0.33333334 + fVar131;
  fVar171 = pfVar3[1] * 0.33333334 + fVar51;
  fVar172 = pfVar3[2] * 0.33333334 + fVar52;
  fVar132 = pfVar3[3] * 0.33333334 + fVar91;
  pfVar3 = (float *)(pGVar7[2].intersectionFilterN + (long)pGVar7[2].pointQueryFunc * lVar38);
  fVar179 = fVar92 - *pfVar3 * 0.33333334;
  fVar202 = fVar93 - pfVar3[1] * 0.33333334;
  fVar212 = fVar94 - pfVar3[2] * 0.33333334;
  fVar214 = fVar95 - pfVar3[3] * 0.33333334;
  fVar223 = *pfVar1 * 0.33333334 + fVar117;
  fVar224 = pfVar1[1] * 0.33333334 + fVar118;
  fVar230 = pfVar1[2] * 0.33333334 + fVar119;
  fVar231 = pfVar1[3] * 0.33333334 + fVar130;
  fVar232 = fVar138 - *pfVar2 * 0.33333334;
  fVar243 = fVar152 - pfVar2[1] * 0.33333334;
  fVar246 = fVar153 - pfVar2[2] * 0.33333334;
  fVar249 = fVar173 - pfVar2[3] * 0.33333334;
  fVar136 = fVar179 * 0.0;
  fVar137 = fVar202 * 0.0;
  fVar177 = fVar212 * 0.0;
  fVar178 = fVar214 * 0.0;
  fVar252 = fVar92 * 0.0 + fVar136;
  fVar258 = fVar93 * 0.0 + fVar137;
  fVar260 = fVar94 * 0.0 + fVar177;
  fVar262 = fVar95 * 0.0 + fVar178;
  fVar233 = fVar154 * 0.0;
  fVar244 = fVar171 * 0.0;
  fVar247 = fVar172 * 0.0;
  fVar250 = fVar132 * 0.0;
  fVar201 = fVar233 + fVar252 + fVar131;
  fVar203 = fVar244 + fVar258 + fVar51;
  fVar213 = fVar247 + fVar260 + fVar52;
  fVar222 = fVar250 + fVar262 + fVar91;
  fVar154 = (fVar154 * 3.0 + fVar252) - fVar131 * 3.0;
  fVar171 = (fVar171 * 3.0 + fVar258) - fVar51 * 3.0;
  fVar172 = (fVar172 * 3.0 + fVar260) - fVar52 * 3.0;
  fVar132 = (fVar132 * 3.0 + fVar262) - fVar91 * 3.0;
  fVar234 = fVar232 * 0.0;
  fVar245 = fVar243 * 0.0;
  fVar248 = fVar246 * 0.0;
  fVar251 = fVar249 * 0.0;
  fVar252 = fVar138 * 0.0 + fVar234;
  fVar258 = fVar152 * 0.0 + fVar245;
  fVar260 = fVar153 * 0.0 + fVar248;
  fVar262 = fVar173 * 0.0 + fVar251;
  fVar253 = fVar223 * 0.0;
  fVar259 = fVar224 * 0.0;
  fVar261 = fVar230 * 0.0;
  fVar263 = fVar231 * 0.0;
  fVar264 = fVar253 + fVar252 + fVar117;
  fVar269 = fVar259 + fVar258 + fVar118;
  fVar271 = fVar261 + fVar260 + fVar119;
  fVar272 = fVar263 + fVar262 + fVar130;
  fVar223 = (fVar223 * 3.0 + fVar252) - fVar117 * 3.0;
  fVar224 = (fVar224 * 3.0 + fVar258) - fVar118 * 3.0;
  fVar230 = (fVar230 * 3.0 + fVar260) - fVar119 * 3.0;
  fVar231 = (fVar231 * 3.0 + fVar262) - fVar130 * 3.0;
  fVar136 = fVar136 + fVar92 + fVar233 + fVar131 * 0.0;
  fVar137 = fVar137 + fVar93 + fVar244 + fVar51 * 0.0;
  fVar177 = fVar177 + fVar94 + fVar247 + fVar52 * 0.0;
  fVar178 = fVar178 + fVar95 + fVar250 + fVar91 * 0.0;
  fVar131 = ((fVar92 * 3.0 - fVar179 * 3.0) + fVar233) - fVar131 * 0.0;
  fVar51 = ((fVar93 * 3.0 - fVar202 * 3.0) + fVar244) - fVar51 * 0.0;
  fVar52 = ((fVar94 * 3.0 - fVar212 * 3.0) + fVar247) - fVar52 * 0.0;
  fVar91 = ((fVar95 * 3.0 - fVar214 * 3.0) + fVar250) - fVar91 * 0.0;
  fVar179 = fVar234 + fVar138 + fVar253 + fVar117 * 0.0;
  fVar202 = fVar245 + fVar152 + fVar259 + fVar118 * 0.0;
  fVar212 = fVar248 + fVar153 + fVar261 + fVar119 * 0.0;
  fVar214 = fVar251 + fVar173 + fVar263 + fVar130 * 0.0;
  fVar92 = ((fVar138 * 3.0 - fVar232 * 3.0) + fVar253) - fVar117 * 0.0;
  fVar93 = ((fVar152 * 3.0 - fVar243 * 3.0) + fVar259) - fVar118 * 0.0;
  fVar94 = ((fVar153 * 3.0 - fVar246 * 3.0) + fVar261) - fVar119 * 0.0;
  fVar95 = ((fVar173 * 3.0 - fVar249 * 3.0) + fVar263) - fVar130 * 0.0;
  fVar232 = fVar171 * fVar264 - fVar269 * fVar154;
  fVar246 = fVar172 * fVar269 - fVar271 * fVar171;
  fVar249 = fVar154 * fVar271 - fVar264 * fVar172;
  fVar252 = fVar132 * fVar272 - fVar272 * fVar132;
  fVar119 = fVar171 * fVar223 - fVar224 * fVar154;
  fVar138 = fVar172 * fVar224 - fVar230 * fVar171;
  fVar152 = fVar154 * fVar230 - fVar223 * fVar172;
  fVar173 = fVar51 * fVar179 - fVar202 * fVar131;
  fVar202 = fVar52 * fVar202 - fVar212 * fVar51;
  fVar212 = fVar131 * fVar212 - fVar179 * fVar52;
  fVar214 = fVar91 * fVar214 - fVar214 * fVar91;
  fVar117 = fVar51 * fVar92 - fVar93 * fVar131;
  fVar93 = fVar52 * fVar93 - fVar94 * fVar51;
  fVar94 = fVar131 * fVar94 - fVar92 * fVar52;
  fVar224 = fVar249 * fVar249 + fVar246 * fVar246 + fVar232 * fVar232;
  auVar160 = ZEXT416((uint)fVar224);
  auVar60 = rsqrtss(ZEXT416((uint)fVar224),auVar160);
  fVar92 = auVar60._0_4_;
  fVar230 = fVar92 * 1.5 - fVar92 * fVar92 * fVar224 * 0.5 * fVar92;
  fVar258 = fVar232 * fVar119 + fVar249 * fVar152 + fVar246 * fVar138;
  fVar92 = fVar252 * fVar230;
  auVar60 = rcpss(auVar160,auVar160);
  fVar130 = (2.0 - fVar224 * auVar60._0_4_) * auVar60._0_4_;
  fVar223 = fVar212 * fVar212 + fVar202 * fVar202 + fVar173 * fVar173;
  auVar60 = ZEXT416((uint)fVar223);
  auVar160 = rsqrtss(ZEXT416((uint)fVar223),auVar60);
  fVar118 = auVar160._0_4_;
  fVar179 = fVar118 * 1.5 - fVar118 * fVar118 * fVar223 * 0.5 * fVar118;
  fVar243 = fVar173 * fVar117 + fVar212 * fVar94 + fVar202 * fVar93;
  fVar153 = fVar214 * fVar179;
  auVar60 = rcpss(auVar60,auVar60);
  fVar118 = (2.0 - fVar223 * auVar60._0_4_) * auVar60._0_4_;
  local_398 = fVar222 * fVar246 * fVar230;
  fStack_394 = fVar222 * fVar249 * fVar230;
  fStack_390 = fVar222 * fVar232 * fVar230;
  fStack_38c = fVar222 * fVar92;
  local_3a8 = fVar201 - local_398;
  fStack_3a4 = fVar203 - fStack_394;
  fStack_3a0 = fVar213 - fStack_390;
  fStack_39c = fVar222 - fStack_38c;
  fVar246 = fVar222 * fVar130 * (fVar224 * fVar138 - fVar258 * fVar246) * fVar230 +
            fVar132 * fVar246 * fVar230;
  fVar249 = fVar222 * fVar130 * (fVar224 * fVar152 - fVar258 * fVar249) * fVar230 +
            fVar132 * fVar249 * fVar230;
  fVar232 = fVar222 * fVar130 * (fVar224 * fVar119 - fVar258 * fVar232) * fVar230 +
            fVar132 * fVar232 * fVar230;
  fVar224 = fVar222 * fVar130 * (fVar224 * (fVar132 * fVar231 - fVar231 * fVar132) -
                                fVar258 * fVar252) * fVar230 + fVar132 * fVar92;
  local_398 = local_398 + fVar201;
  fStack_394 = fStack_394 + fVar203;
  fStack_390 = fStack_390 + fVar213;
  fStack_38c = fStack_38c + fVar222;
  fVar119 = fVar178 * fVar202 * fVar179;
  fVar130 = fVar178 * fVar212 * fVar179;
  fVar138 = fVar178 * fVar173 * fVar179;
  fVar152 = fVar178 * fVar153;
  local_3c8 = fVar136 - fVar119;
  fStack_3c4 = fVar137 - fVar130;
  fStack_3c0 = fVar177 - fVar138;
  fStack_3bc = fVar178 - fVar152;
  fVar92 = fVar178 * fVar118 * (fVar223 * fVar93 - fVar243 * fVar202) * fVar179 +
           fVar91 * fVar202 * fVar179;
  fVar93 = fVar178 * fVar118 * (fVar223 * fVar94 - fVar243 * fVar212) * fVar179 +
           fVar91 * fVar212 * fVar179;
  fVar94 = fVar178 * fVar118 * (fVar223 * fVar117 - fVar243 * fVar173) * fVar179 +
           fVar91 * fVar173 * fVar179;
  fVar95 = fVar178 * fVar118 * (fVar223 * (fVar91 * fVar95 - fVar95 * fVar91) - fVar243 * fVar214) *
                     fVar179 + fVar91 * fVar153;
  fVar119 = fVar119 + fVar136;
  fVar130 = fVar130 + fVar137;
  fVar138 = fVar138 + fVar177;
  fVar152 = fVar152 + fVar178;
  local_3b8 = (fVar154 - fVar246) * 0.33333334 + local_3a8;
  fStack_3b4 = (fVar171 - fVar249) * 0.33333334 + fStack_3a4;
  fStack_3b0 = (fVar172 - fVar232) * 0.33333334 + fStack_3a0;
  fStack_3ac = (fVar132 - fVar224) * 0.33333334 + fStack_39c;
  local_3d8 = local_3c8 - (fVar131 - fVar92) * 0.33333334;
  fStack_3d4 = fStack_3c4 - (fVar51 - fVar93) * 0.33333334;
  fStack_3d0 = fStack_3c0 - (fVar52 - fVar94) * 0.33333334;
  fStack_3cc = fStack_3bc - (fVar91 - fVar95) * 0.33333334;
  fVar153 = fVar119 - (fVar92 + fVar131) * 0.33333334;
  fVar173 = fVar130 - (fVar93 + fVar51) * 0.33333334;
  fVar136 = fVar138 - (fVar94 + fVar52) * 0.33333334;
  fVar137 = fVar152 - (fVar95 + fVar91) * 0.33333334;
  local_158 = local_3a8 - local_1c8;
  fStack_154 = fStack_3a4 - fStack_1c4;
  fStack_150 = fStack_3a0 - fStack_1c0;
  fStack_14c = fStack_39c - 0.0;
  fVar131 = pre->ray_space[k].vx.field_0.m128[0];
  fVar51 = pre->ray_space[k].vx.field_0.m128[1];
  fVar52 = pre->ray_space[k].vy.field_0.m128[0];
  fVar91 = pre->ray_space[k].vy.field_0.m128[1];
  fVar92 = pre->ray_space[k].vz.field_0.m128[0];
  fVar93 = pre->ray_space[k].vz.field_0.m128[1];
  fVar94 = local_158 * fVar131 + fStack_154 * fVar52 + fStack_150 * fVar92;
  fVar117 = local_158 * fVar51 + fStack_154 * fVar91 + fStack_150 * fVar93;
  local_168 = local_3b8 - local_1c8;
  fStack_164 = fStack_3b4 - fStack_1c4;
  fStack_160 = fStack_3b0 - fStack_1c0;
  fStack_15c = fStack_3ac - 0.0;
  fVar95 = local_168 * fVar131 + fStack_164 * fVar52 + fStack_160 * fVar92;
  fVar118 = local_168 * fVar51 + fStack_164 * fVar91 + fStack_160 * fVar93;
  auVar141._4_4_ = fVar118;
  auVar141._0_4_ = fVar95;
  local_178 = local_3d8 - local_1c8;
  fStack_174 = fStack_3d4 - fStack_1c4;
  fStack_170 = fStack_3d0 - fStack_1c0;
  fStack_16c = fStack_3cc - 0.0;
  fVar177 = local_178 * fVar131 + fStack_174 * fVar52 + fStack_170 * fVar92;
  fVar178 = local_178 * fVar51 + fStack_174 * fVar91 + fStack_170 * fVar93;
  auVar102._4_4_ = fVar178;
  auVar102._0_4_ = fVar177;
  local_188 = local_3c8 - local_1c8;
  fStack_184 = fStack_3c4 - fStack_1c4;
  fStack_180 = fStack_3c0 - fStack_1c0;
  fStack_17c = fStack_3bc - 0.0;
  fVar202 = local_188 * fVar131 + fStack_184 * fVar52 + fStack_180 * fVar92;
  fVar203 = local_188 * fVar51 + fStack_184 * fVar91 + fStack_180 * fVar93;
  auVar266._4_4_ = fVar203;
  auVar266._0_4_ = fVar202;
  local_198 = local_398 - local_1c8;
  fStack_194 = fStack_394 - fStack_1c4;
  fStack_190 = fStack_390 - fStack_1c0;
  fStack_18c = fStack_38c - 0.0;
  fVar179 = local_198 * fVar131 + fStack_194 * fVar52 + fStack_190 * fVar92;
  fVar201 = local_198 * fVar51 + fStack_194 * fVar91 + fStack_190 * fVar93;
  local_288 = (fVar246 + fVar154) * 0.33333334 + local_398;
  fStack_284 = (fVar249 + fVar171) * 0.33333334 + fStack_394;
  fStack_280 = (fVar232 + fVar172) * 0.33333334 + fStack_390;
  fStack_27c = (fVar224 + fVar132) * 0.33333334 + fStack_38c;
  local_1a8 = local_288 - local_1c8;
  fStack_1a4 = fStack_284 - fStack_1c4;
  fStack_1a0 = fStack_280 - fStack_1c0;
  fStack_19c = fStack_27c - 0.0;
  fVar172 = local_1a8 * fVar131 + fStack_1a4 * fVar52 + fStack_1a0 * fVar92;
  fVar132 = local_1a8 * fVar51 + fStack_1a4 * fVar91 + fStack_1a0 * fVar93;
  auVar141._12_4_ = fVar132;
  auVar141._8_4_ = fVar172;
  local_1b8 = fVar153 - local_1c8;
  fStack_1b4 = fVar173 - fStack_1c4;
  fStack_1b0 = fVar136 - fStack_1c0;
  fStack_1ac = fVar137 - 0.0;
  fVar154 = local_1b8 * fVar131 + fStack_1b4 * fVar52 + fStack_1b0 * fVar92;
  fVar171 = local_1b8 * fVar51 + fStack_1b4 * fVar91 + fStack_1b0 * fVar93;
  local_1c8 = fVar119 - local_1c8;
  fStack_1c4 = fVar130 - fStack_1c4;
  fStack_1c0 = fVar138 - fStack_1c0;
  fStack_1bc = fVar152 - 0.0;
  fVar131 = local_1c8 * fVar131 + fStack_1c4 * fVar52 + fStack_1c0 * fVar92;
  fVar51 = local_1c8 * fVar51 + fStack_1c4 * fVar91 + fStack_1c0 * fVar93;
  auVar266._12_4_ = fVar51;
  auVar266._8_4_ = fVar131;
  local_348 = CONCAT44(fVar117,fVar94);
  auVar74._8_4_ = fVar179;
  auVar74._0_8_ = local_348;
  auVar74._12_4_ = fVar201;
  auVar60 = minps(auVar74,auVar141);
  auVar102._8_4_ = fVar154;
  auVar102._12_4_ = fVar171;
  auVar160 = minps(auVar102,auVar266);
  auVar60 = minps(auVar60,auVar160);
  auVar103._8_4_ = fVar179;
  auVar103._0_8_ = local_348;
  auVar103._12_4_ = fVar201;
  auVar160 = maxps(auVar103,auVar141);
  auVar122._4_4_ = fVar178;
  auVar122._0_4_ = fVar177;
  auVar122._8_4_ = fVar154;
  auVar122._12_4_ = fVar171;
  auVar123 = maxps(auVar122,auVar266);
  auVar161 = maxps(auVar160,auVar123);
  auVar10._4_8_ = auVar123._8_8_;
  auVar10._0_4_ = auVar60._4_4_;
  auVar124._0_8_ = auVar10._0_8_ << 0x20;
  auVar124._8_4_ = auVar60._8_4_;
  auVar124._12_4_ = auVar60._12_4_;
  auVar125._8_8_ = auVar60._8_8_;
  auVar125._0_8_ = auVar124._8_8_;
  auVar160 = minps(auVar60,auVar125);
  auVar11._4_8_ = auVar60._8_8_;
  auVar11._0_4_ = auVar161._4_4_;
  auVar126._0_8_ = auVar11._0_8_ << 0x20;
  auVar126._8_4_ = auVar161._8_4_;
  auVar126._12_4_ = auVar161._12_4_;
  auVar127._8_8_ = auVar161._8_8_;
  auVar127._0_8_ = auVar126._8_8_;
  auVar60 = maxps(auVar161,auVar127);
  auVar75._0_8_ = auVar160._0_8_ & 0x7fffffff7fffffff;
  auVar75._8_4_ = auVar160._8_4_ & 0x7fffffff;
  auVar75._12_4_ = auVar160._12_4_ & 0x7fffffff;
  auVar104._0_8_ = auVar60._0_8_ & 0x7fffffff7fffffff;
  auVar104._8_4_ = auVar60._8_4_ & 0x7fffffff;
  auVar104._12_4_ = auVar60._12_4_ & 0x7fffffff;
  auVar60 = maxps(auVar75,auVar104);
  fStack_114 = auVar60._4_4_;
  local_118 = fStack_114;
  if (fStack_114 <= auVar60._0_4_) {
    local_118 = auVar60._0_4_;
  }
  uVar43 = (ulong)uVar45 + 0xf;
  local_118 = local_118 * 9.536743e-07;
  fStack_110 = fStack_114;
  fStack_10c = fStack_114;
  local_258 = local_118;
  fStack_254 = local_118;
  fStack_250 = local_118;
  fStack_24c = local_118;
  local_268 = -local_118;
  fStack_264 = -local_118;
  fStack_260 = -local_118;
  fStack_25c = -local_118;
  afStack_338[0] = fVar179;
  afStack_338[1] = fVar201;
  local_128 = fVar95 - fVar94;
  fStack_124 = fVar118 - fVar117;
  fStack_120 = fVar172 - fVar179;
  fStack_11c = fVar132 - fVar201;
  local_138 = fVar177 - fVar95;
  fStack_134 = fVar178 - fVar118;
  fStack_130 = fVar154 - fVar172;
  fStack_12c = fVar171 - fVar132;
  local_148 = fVar202 - fVar177;
  fStack_144 = fVar203 - fVar178;
  fStack_140 = fVar131 - fVar154;
  fStack_13c = fVar51 - fVar171;
  local_2a8 = local_398 - local_3a8;
  fStack_2a4 = fStack_394 - fStack_3a4;
  fStack_2a0 = fStack_390 - fStack_3a0;
  fStack_29c = fStack_38c - fStack_39c;
  local_2b8 = local_288 - local_3b8;
  fStack_2b4 = fStack_284 - fStack_3b4;
  fStack_2b0 = fStack_280 - fStack_3b0;
  fStack_2ac = fStack_27c - fStack_3ac;
  local_2c8 = fVar153 - local_3d8;
  fStack_2c4 = fVar173 - fStack_3d4;
  fStack_2c0 = fVar136 - fStack_3d0;
  fStack_2bc = fVar137 - fStack_3cc;
  local_2d8 = fVar119 - local_3c8;
  fStack_2d4 = fVar130 - fStack_3c4;
  fStack_2d0 = fVar138 - fStack_3c0;
  fStack_2cc = fVar152 - fStack_3bc;
  uStack_2e4 = local_2e8;
  uStack_2e0 = local_2e8;
  uStack_2dc = local_2e8;
  uStack_2f4 = local_2f8;
  uStack_2f0 = local_2f8;
  uStack_2ec = local_2f8;
  local_53c = 0;
  uVar46 = 0;
  fVar52 = *(float *)(ray + k * 4 + 0x30);
  fVar91 = 0.0;
  fVar92 = 1.0;
  fVar93 = 0.0;
  fVar152 = 1.0;
  local_3e0 = uVar43;
LAB_00a7559f:
  do {
    fVar153 = 1.0 - fVar91;
    fVar173 = 1.0 - fVar91;
    fVar137 = 1.0 - fVar92;
    fVar212 = 1.0 - fVar92;
    fVar252 = fVar94 * fVar153 + fVar179 * fVar91;
    fVar244 = fVar117 * fVar173 + fVar201 * fVar91;
    fVar245 = fVar94 * fVar137 + fVar179 * fVar92;
    fVar247 = fVar117 * fVar212 + fVar201 * fVar92;
    fVar213 = fVar95 * fVar153 + fVar172 * fVar91;
    fVar262 = fVar118 * fVar173 + fVar132 * fVar91;
    fVar233 = fVar95 * fVar137 + fVar172 * fVar92;
    fVar234 = fVar118 * fVar212 + fVar132 * fVar92;
    fVar251 = fVar177 * fVar153 + fVar154 * fVar91;
    fVar253 = fVar178 * fVar173 + fVar171 * fVar91;
    fVar278 = fVar177 * fVar137 + fVar154 * fVar92;
    fVar279 = fVar178 * fVar212 + fVar171 * fVar92;
    fVar248 = fVar153 * fVar202 + fVar91 * fVar131;
    fVar250 = fVar173 * fVar203 + fVar91 * fVar51;
    fVar263 = fVar137 * fVar202 + fVar92 * fVar131;
    fVar264 = fVar212 * fVar203 + fVar92 * fVar51;
    fVar269 = (fVar152 - fVar93) * 0.11111111;
    local_4e8 = CONCAT44(fVar152,fVar93);
    fVar271 = (fVar152 - fVar93) * 0.0 + fVar93;
    fVar272 = (fVar152 - fVar93) * 0.33333334 + fVar93;
    fVar276 = (fVar152 - fVar93) * 0.6666667 + fVar93;
    fVar93 = (fVar152 - fVar93) * 1.0 + fVar93;
    fVar173 = 1.0 - fVar271;
    fVar212 = 1.0 - fVar272;
    fVar214 = 1.0 - fVar276;
    fVar230 = 1.0 - fVar93;
    fVar222 = fVar213 * fVar173 + fVar251 * fVar271;
    fVar223 = fVar213 * fVar212 + fVar251 * fVar272;
    fVar224 = fVar213 * fVar214 + fVar251 * fVar276;
    fVar231 = fVar213 * fVar230 + fVar251 * fVar93;
    fVar232 = fVar262 * fVar173 + fVar253 * fVar271;
    fVar243 = fVar262 * fVar212 + fVar253 * fVar272;
    fVar246 = fVar262 * fVar214 + fVar253 * fVar276;
    fVar249 = fVar262 * fVar230 + fVar253 * fVar93;
    fVar152 = (fVar252 * fVar173 + fVar213 * fVar271) * fVar173 + fVar271 * fVar222;
    fVar153 = (fVar252 * fVar212 + fVar213 * fVar272) * fVar212 + fVar272 * fVar223;
    fVar137 = (fVar252 * fVar214 + fVar213 * fVar276) * fVar214 + fVar276 * fVar224;
    fVar213 = (fVar252 * fVar230 + fVar213 * fVar93) * fVar230 + fVar93 * fVar231;
    fVar252 = (fVar244 * fVar173 + fVar262 * fVar271) * fVar173 + fVar271 * fVar232;
    fVar258 = (fVar244 * fVar212 + fVar262 * fVar272) * fVar212 + fVar272 * fVar243;
    fVar260 = (fVar244 * fVar214 + fVar262 * fVar276) * fVar214 + fVar276 * fVar246;
    fVar262 = (fVar244 * fVar230 + fVar262 * fVar93) * fVar230 + fVar93 * fVar249;
    fVar222 = fVar222 * fVar173 + (fVar251 * fVar173 + fVar248 * fVar271) * fVar271;
    fVar223 = fVar223 * fVar212 + (fVar251 * fVar212 + fVar248 * fVar272) * fVar272;
    fVar224 = fVar224 * fVar214 + (fVar251 * fVar214 + fVar248 * fVar276) * fVar276;
    fVar231 = fVar231 * fVar230 + (fVar251 * fVar230 + fVar248 * fVar93) * fVar93;
    fVar232 = fVar232 * fVar173 + (fVar253 * fVar173 + fVar250 * fVar271) * fVar271;
    fVar243 = fVar243 * fVar212 + (fVar253 * fVar212 + fVar250 * fVar272) * fVar272;
    fVar246 = fVar246 * fVar214 + (fVar253 * fVar214 + fVar250 * fVar276) * fVar276;
    fVar249 = fVar249 * fVar230 + (fVar253 * fVar230 + fVar250 * fVar93) * fVar93;
    local_388 = fVar173 * fVar152 + fVar271 * fVar222;
    fStack_384 = fVar212 * fVar153 + fVar272 * fVar223;
    fStack_380 = fVar214 * fVar137 + fVar276 * fVar224;
    fStack_37c = fVar230 * fVar213 + fVar93 * fVar231;
    local_248 = fVar173 * fVar252 + fVar271 * fVar232;
    fStack_244 = fVar212 * fVar258 + fVar272 * fVar243;
    fStack_240 = fVar214 * fVar260 + fVar276 * fVar246;
    fStack_23c = fVar230 * fVar262 + fVar93 * fVar249;
    fVar223 = (fVar223 - fVar153) * 3.0 * fVar269;
    fVar224 = (fVar224 - fVar137) * 3.0 * fVar269;
    fVar231 = (fVar231 - fVar213) * 3.0 * fVar269;
    fVar243 = (fVar243 - fVar258) * 3.0 * fVar269;
    fVar246 = (fVar246 - fVar260) * 3.0 * fVar269;
    fVar249 = (fVar249 - fVar262) * 3.0 * fVar269;
    local_358._4_4_ = fStack_380;
    local_358._0_4_ = fStack_384;
    local_358._8_4_ = fStack_37c;
    local_358._12_4_ = 0;
    local_1e8._4_4_ = fStack_240;
    local_1e8._0_4_ = fStack_244;
    local_368 = local_388 + (fVar222 - fVar152) * 3.0 * fVar269;
    fStack_364 = fStack_384 + fVar223;
    fStack_360 = fStack_380 + fVar224;
    fStack_35c = fStack_37c + fVar231;
    fVar152 = local_248 + (fVar232 - fVar252) * 3.0 * fVar269;
    fVar153 = fStack_244 + fVar243;
    fVar137 = fStack_240 + fVar246;
    fVar213 = fStack_23c + fVar249;
    local_378._0_4_ = fStack_384 - fVar223;
    local_378._4_4_ = fStack_380 - fVar224;
    local_378._8_4_ = fStack_37c - fVar231;
    local_378._12_4_ = 0;
    local_528._0_4_ = fStack_244 - fVar243;
    local_528._4_4_ = fStack_240 - fVar246;
    fStack_520 = fStack_23c - fVar249;
    fStack_51c = 0.0;
    fVar222 = fVar233 * fVar173 + fVar278 * fVar271;
    fVar223 = fVar233 * fVar212 + fVar278 * fVar272;
    fVar224 = fVar233 * fVar214 + fVar278 * fVar276;
    fVar231 = fVar233 * fVar230 + fVar278 * fVar93;
    fVar232 = fVar234 * fVar173 + fVar279 * fVar271;
    fVar243 = fVar234 * fVar212 + fVar279 * fVar272;
    fVar246 = fVar234 * fVar214 + fVar279 * fVar276;
    fVar250 = fVar234 * fVar230 + fVar279 * fVar93;
    fVar249 = (fVar245 * fVar173 + fVar233 * fVar271) * fVar173 + fVar271 * fVar222;
    fVar252 = (fVar245 * fVar212 + fVar233 * fVar272) * fVar212 + fVar272 * fVar223;
    fVar258 = (fVar245 * fVar214 + fVar233 * fVar276) * fVar214 + fVar276 * fVar224;
    fVar260 = (fVar245 * fVar230 + fVar233 * fVar93) * fVar230 + fVar93 * fVar231;
    fVar251 = (fVar247 * fVar173 + fVar234 * fVar271) * fVar173 + fVar271 * fVar232;
    fVar253 = (fVar247 * fVar212 + fVar234 * fVar272) * fVar212 + fVar272 * fVar243;
    fVar259 = (fVar247 * fVar214 + fVar234 * fVar276) * fVar214 + fVar276 * fVar246;
    fVar261 = (fVar247 * fVar230 + fVar234 * fVar93) * fVar230 + fVar93 * fVar250;
    fVar262 = fVar222 * fVar173 + (fVar278 * fVar173 + fVar263 * fVar271) * fVar271;
    fVar233 = fVar223 * fVar212 + (fVar278 * fVar212 + fVar263 * fVar272) * fVar272;
    fVar234 = fVar224 * fVar214 + (fVar278 * fVar214 + fVar263 * fVar276) * fVar276;
    fVar244 = fVar231 * fVar230 + (fVar278 * fVar230 + fVar263 * fVar93) * fVar93;
    fVar245 = fVar232 * fVar173 + (fVar279 * fVar173 + fVar264 * fVar271) * fVar271;
    fVar247 = fVar243 * fVar212 + (fVar279 * fVar212 + fVar264 * fVar272) * fVar272;
    fVar248 = fVar246 * fVar214 + (fVar279 * fVar214 + fVar264 * fVar276) * fVar276;
    fVar250 = fVar250 * fVar230 + (fVar279 * fVar230 + fVar264 * fVar93) * fVar93;
    fVar231 = fVar173 * fVar249 + fVar271 * fVar262;
    fVar232 = fVar212 * fVar252 + fVar272 * fVar233;
    fVar243 = fVar214 * fVar258 + fVar276 * fVar234;
    fVar246 = fVar230 * fVar260 + fVar93 * fVar244;
    fVar222 = fVar173 * fVar251 + fVar271 * fVar245;
    fVar223 = fVar212 * fVar253 + fVar272 * fVar247;
    fVar224 = fVar214 * fVar259 + fVar276 * fVar248;
    fVar230 = fVar230 * fVar261 + fVar93 * fVar250;
    fVar93 = (fVar233 - fVar252) * 3.0 * fVar269;
    fVar173 = (fVar234 - fVar258) * 3.0 * fVar269;
    fVar212 = (fVar244 - fVar260) * 3.0 * fVar269;
    fVar214 = (fVar247 - fVar253) * 3.0 * fVar269;
    fVar252 = (fVar248 - fVar259) * 3.0 * fVar269;
    fVar258 = (fVar250 - fVar261) * 3.0 * fVar269;
    local_1f8._4_4_ = fVar243;
    local_1f8._0_4_ = fVar232;
    local_1f8._8_4_ = fVar246;
    local_1f8._12_4_ = 0;
    local_218._4_4_ = fVar224;
    local_218._0_4_ = fVar223;
    local_218._8_4_ = fVar230;
    local_218._12_4_ = 0;
    local_238 = fVar231 + (fVar262 - fVar249) * 3.0 * fVar269;
    fStack_234 = fVar232 + fVar93;
    fStack_230 = fVar243 + fVar173;
    fStack_22c = fVar246 + fVar212;
    local_208 = fVar222 + (fVar245 - fVar251) * 3.0 * fVar269;
    fStack_204 = fVar223 + fVar214;
    fStack_200 = fVar224 + fVar252;
    fStack_1fc = fVar230 + fVar258;
    local_1d8._0_4_ = fVar232 - fVar93;
    local_1d8._4_4_ = fVar243 - fVar173;
    local_1d8._8_4_ = fVar246 - fVar212;
    local_1d8._12_4_ = 0;
    local_228._0_4_ = fVar223 - fVar214;
    local_228._4_4_ = fVar224 - fVar252;
    local_228._8_4_ = fVar230 - fVar258;
    local_228._12_4_ = 0;
    fVar93 = (fVar232 - fStack_384) + (fVar231 - local_388);
    fVar173 = (fVar243 - fStack_380) + (fVar232 - fStack_384);
    fVar212 = (fVar246 - fStack_37c) + (fVar243 - fStack_380);
    fVar214 = (fVar246 - fStack_37c) + 0.0;
    local_1e8._8_4_ = fStack_23c;
    local_1e8._12_4_ = 0;
    fVar249 = (fVar223 - fStack_244) + (fVar222 - local_248);
    fVar252 = (fVar224 - fStack_240) + (fVar223 - fStack_244);
    fVar258 = (fVar230 - fStack_23c) + (fVar224 - fStack_240);
    fVar260 = (fVar230 - fStack_23c) + 0.0;
    auVar194._0_8_ =
         CONCAT44(fStack_244 * fVar173 - fStack_384 * fVar252,
                  local_248 * fVar93 - local_388 * fVar249);
    auVar194._8_4_ = fStack_240 * fVar212 - fStack_380 * fVar258;
    auVar194._12_4_ = fStack_23c * fVar214 - fStack_37c * fVar260;
    auVar142._0_4_ = fVar152 * fVar93 - local_368 * fVar249;
    auVar142._4_4_ = fVar153 * fVar173 - fStack_364 * fVar252;
    auVar142._8_4_ = fVar137 * fVar212 - fStack_360 * fVar258;
    auVar142._12_4_ = fVar213 * fVar214 - fStack_35c * fVar260;
    auVar162._0_8_ =
         CONCAT44((float)local_528._4_4_ * fVar173 - fVar252 * local_378._4_4_,
                  (float)local_528._0_4_ * fVar93 - fVar249 * local_378._0_4_);
    auVar162._8_4_ = fStack_520 * fVar212 - fVar258 * local_378._8_4_;
    auVar162._12_4_ = fVar214 * 0.0 - fVar260 * 0.0;
    auVar255._0_4_ = fVar93 * fStack_244 - fVar249 * fStack_384;
    auVar255._4_4_ = fVar173 * fStack_240 - fVar252 * fStack_380;
    auVar255._8_4_ = fVar212 * fStack_23c - fVar258 * fStack_37c;
    auVar255._12_4_ = fVar214 * 0.0 - fVar260 * 0.0;
    auVar215._0_8_ =
         CONCAT44(fVar223 * fVar173 - fVar232 * fVar252,fVar222 * fVar93 - fVar231 * fVar249);
    auVar215._8_4_ = fVar224 * fVar212 - fVar243 * fVar258;
    auVar215._12_4_ = fVar230 * fVar214 - fVar246 * fVar260;
    auVar267._0_4_ = local_208 * fVar93 - local_238 * fVar249;
    auVar267._4_4_ = fStack_204 * fVar173 - fStack_234 * fVar252;
    auVar267._8_4_ = fStack_200 * fVar212 - fStack_230 * fVar258;
    auVar267._12_4_ = fStack_1fc * fVar214 - fStack_22c * fVar260;
    auVar205._0_8_ =
         CONCAT44(local_228._4_4_ * fVar173 - fVar252 * local_1d8._4_4_,
                  local_228._0_4_ * fVar93 - fVar249 * local_1d8._0_4_);
    auVar205._8_4_ = local_228._8_4_ * fVar212 - fVar258 * local_1d8._8_4_;
    auVar205._12_4_ = fVar214 * 0.0 - fVar260 * 0.0;
    auVar76._0_4_ = fVar93 * fVar223 - fVar249 * fVar232;
    auVar76._4_4_ = fVar173 * fVar224 - fVar252 * fVar243;
    auVar76._8_4_ = fVar212 * fVar230 - fVar258 * fVar246;
    auVar76._12_4_ = fVar214 * 0.0 - fVar260 * 0.0;
    auVar105._8_4_ = auVar194._8_4_;
    auVar105._0_8_ = auVar194._0_8_;
    auVar105._12_4_ = auVar194._12_4_;
    auVar60 = minps(auVar105,auVar142);
    auVar161 = maxps(auVar194,auVar142);
    auVar143._8_4_ = auVar162._8_4_;
    auVar143._0_8_ = auVar162._0_8_;
    auVar143._12_4_ = auVar162._12_4_;
    auVar160 = minps(auVar143,auVar255);
    auVar60 = minps(auVar60,auVar160);
    auVar160 = maxps(auVar162,auVar255);
    auVar123 = maxps(auVar161,auVar160);
    auVar144._8_4_ = auVar215._8_4_;
    auVar144._0_8_ = auVar215._0_8_;
    auVar144._12_4_ = auVar215._12_4_;
    auVar160 = minps(auVar144,auVar267);
    auVar216 = maxps(auVar215,auVar267);
    auVar163._8_4_ = auVar205._8_4_;
    auVar163._0_8_ = auVar205._0_8_;
    auVar163._12_4_ = auVar205._12_4_;
    auVar161 = minps(auVar163,auVar76);
    auVar160 = minps(auVar160,auVar161);
    auVar60 = minps(auVar60,auVar160);
    auVar160 = maxps(auVar205,auVar76);
    auVar160 = maxps(auVar216,auVar160);
    auVar160 = maxps(auVar123,auVar160);
    auVar195._0_4_ =
         -(uint)(local_268 <= auVar160._0_4_ && auVar60._0_4_ <= local_258) & local_278._0_4_;
    auVar195._4_4_ =
         -(uint)(fStack_264 <= auVar160._4_4_ && auVar60._4_4_ <= fStack_254) & local_278._4_4_;
    auVar195._8_4_ =
         -(uint)(fStack_260 <= auVar160._8_4_ && auVar60._8_4_ <= fStack_250) & local_278._8_4_;
    auVar195._12_4_ =
         -(uint)(fStack_25c <= auVar160._12_4_ && auVar60._12_4_ <= fStack_24c) & local_278._12_4_;
    iVar35 = movmskps((int)uVar37,auVar195);
    if (iVar35 != 0) {
      fVar93 = (fVar232 - fVar231) + (fStack_384 - local_388);
      fVar173 = (fVar243 - fVar232) + (fStack_380 - fStack_384);
      fVar212 = (fVar246 - fVar243) + (fStack_37c - fStack_380);
      fVar214 = (0.0 - fVar246) + (0.0 - fStack_37c);
      fVar249 = (fVar223 - fVar222) + (fStack_244 - local_248);
      fVar252 = (fVar224 - fVar223) + (fStack_240 - fStack_244);
      fVar258 = (fVar230 - fVar224) + (fStack_23c - fStack_240);
      fVar260 = (0.0 - fVar230) + (0.0 - fStack_23c);
      auVar273._0_8_ =
           CONCAT44(fStack_244 * fVar173 - fStack_384 * fVar252,
                    local_248 * fVar93 - local_388 * fVar249);
      auVar273._8_4_ = fStack_240 * fVar212 - fStack_380 * fVar258;
      auVar273._12_4_ = fStack_23c * fVar214 - fStack_37c * fVar260;
      auVar145._0_4_ = fVar152 * fVar93 - local_368 * fVar249;
      auVar145._4_4_ = fVar153 * fVar173 - fStack_364 * fVar252;
      auVar145._8_4_ = fVar137 * fVar212 - fStack_360 * fVar258;
      auVar145._12_4_ = fVar213 * fVar214 - fStack_35c * fVar260;
      auVar206._0_8_ =
           CONCAT44((float)local_528._4_4_ * fVar173 - local_378._4_4_ * fVar252,
                    (float)local_528._0_4_ * fVar93 - local_378._0_4_ * fVar249);
      auVar206._8_4_ = fStack_520 * fVar212 - local_378._8_4_ * fVar258;
      auVar206._12_4_ = fVar214 * 0.0 - fVar260 * 0.0;
      auVar164._0_4_ = fStack_244 * fVar93 - fStack_384 * fVar249;
      auVar164._4_4_ = fStack_240 * fVar173 - fStack_380 * fVar252;
      auVar164._8_4_ = fStack_23c * fVar212 - fStack_37c * fVar258;
      auVar164._12_4_ = fVar214 * 0.0 - fVar260 * 0.0;
      auVar128._0_8_ =
           CONCAT44(fVar223 * fVar173 - fVar232 * fVar252,fVar222 * fVar93 - fVar231 * fVar249);
      auVar128._8_4_ = fVar224 * fVar212 - fVar243 * fVar258;
      auVar128._12_4_ = fVar230 * fVar214 - fVar246 * fVar260;
      auVar225._0_4_ = local_208 * fVar93 - local_238 * fVar249;
      auVar225._4_4_ = fStack_204 * fVar173 - fStack_234 * fVar252;
      auVar225._8_4_ = fStack_200 * fVar212 - fStack_230 * fVar258;
      auVar225._12_4_ = fStack_1fc * fVar214 - fStack_22c * fVar260;
      auVar256._0_8_ =
           CONCAT44(local_228._4_4_ * fVar173 - local_1d8._4_4_ * fVar252,
                    local_228._0_4_ * fVar93 - local_1d8._0_4_ * fVar249);
      auVar256._8_4_ = local_228._8_4_ * fVar212 - local_1d8._8_4_ * fVar258;
      auVar256._12_4_ = fVar214 * 0.0 - fVar260 * 0.0;
      auVar77._0_4_ = fVar93 * fVar223 - fVar249 * fVar232;
      auVar77._4_4_ = fVar173 * fVar224 - fVar252 * fVar243;
      auVar77._8_4_ = fVar212 * fVar230 - fVar258 * fVar246;
      auVar77._12_4_ = fVar214 * 0.0 - fVar260 * 0.0;
      auVar106._8_4_ = auVar273._8_4_;
      auVar106._0_8_ = auVar273._0_8_;
      auVar106._12_4_ = auVar273._12_4_;
      auVar60 = minps(auVar106,auVar145);
      auVar161 = maxps(auVar273,auVar145);
      auVar146._8_4_ = auVar206._8_4_;
      auVar146._0_8_ = auVar206._0_8_;
      auVar146._12_4_ = auVar206._12_4_;
      auVar160 = minps(auVar146,auVar164);
      auVar60 = minps(auVar60,auVar160);
      auVar160 = maxps(auVar206,auVar164);
      auVar216 = maxps(auVar161,auVar160);
      auVar147._8_4_ = auVar128._8_4_;
      auVar147._0_8_ = auVar128._0_8_;
      auVar147._12_4_ = auVar128._12_4_;
      auVar161 = minps(auVar147,auVar225);
      auVar160 = maxps(auVar128,auVar225);
      auVar165._8_4_ = auVar256._8_4_;
      auVar165._0_8_ = auVar256._0_8_;
      auVar165._12_4_ = auVar256._12_4_;
      auVar123 = minps(auVar165,auVar77);
      auVar161 = minps(auVar161,auVar123);
      auVar60 = minps(auVar60,auVar161);
      auVar161 = maxps(auVar256,auVar77);
      auVar160 = maxps(auVar160,auVar161);
      auVar160 = maxps(auVar216,auVar160);
      auVar274._0_4_ =
           -(uint)(local_268 <= auVar160._0_4_ && auVar60._0_4_ <= local_258) & auVar195._0_4_;
      auVar274._4_4_ =
           -(uint)(fStack_264 <= auVar160._4_4_ && auVar60._4_4_ <= fStack_254) & auVar195._4_4_;
      auVar274._8_4_ =
           -(uint)(fStack_260 <= auVar160._8_4_ && auVar60._8_4_ <= fStack_250) & auVar195._8_4_;
      auVar274._12_4_ =
           -(uint)(fStack_25c <= auVar160._12_4_ && auVar60._12_4_ <= fStack_24c) & auVar195._12_4_;
      uVar48 = movmskps(iVar35,auVar274);
      if (uVar48 != 0) {
        uVar43 = (ulong)uVar46;
        afStack_338[uVar43] = (float)(uVar48 & 0xff);
        *(undefined8 *)(afStack_108 + uVar43 * 2) = local_4e8;
        *(ulong *)(afStack_58 + uVar43 * 2) = CONCAT44(fVar92,fVar91);
        uVar46 = uVar46 + 1;
      }
    }
LAB_00a75c20:
    auVar60 = _local_528;
    bVar41 = SUB41(local_53c,0);
    if (uVar46 == 0) {
      if (local_53c != 0) {
        return bVar41;
      }
      fVar131 = *(float *)(ray + k * 4 + 0x80);
      auVar116._4_4_ = -(uint)(fStack_294 <= fVar131);
      auVar116._0_4_ = -(uint)(local_298 <= fVar131);
      auVar116._8_4_ = -(uint)(fStack_290 <= fVar131);
      auVar116._12_4_ = -(uint)(fStack_28c <= fVar131);
      uVar46 = movmskps((int)uVar43,auVar116);
      uVar45 = uVar45 & (uint)local_3e0 & uVar46;
      if (uVar45 == 0) {
        return bVar41;
      }
      goto LAB_00a74d1d;
    }
    uVar48 = uVar46 - 1;
    uVar37 = (ulong)uVar48;
    fVar93 = afStack_338[uVar37];
    fVar91 = afStack_58[uVar37 * 2];
    fVar92 = afStack_58[uVar37 * 2 + 1];
    uVar36 = 0;
    if (fVar93 != 0.0) {
      for (; ((uint)fVar93 >> uVar36 & 1) == 0; uVar36 = uVar36 + 1) {
      }
    }
    fVar93 = (float)((int)fVar93 - 1U & (uint)fVar93);
    afStack_338[uVar37] = fVar93;
    if (fVar93 == 0.0) {
      uVar46 = uVar48;
    }
    uVar42 = uVar36 + 1;
    uVar43 = uVar42;
    if ((long)uVar42 < 0) {
      uVar43 = (ulong)((uint)uVar42 & 1) | uVar42 >> 1;
    }
    fVar153 = afStack_108[uVar37 * 2];
    fVar173 = afStack_108[uVar37 * 2 + 1];
    fVar93 = fVar153 * (1.0 - (float)uVar36 * 0.33333334) + fVar173 * (float)uVar36 * 0.33333334;
    fVar152 = fVar153 * (1.0 - (float)uVar42 * 0.33333334) + fVar173 * (float)uVar42 * 0.33333334;
    fVar212 = fVar153 * 0.0 + fVar173 * 0.0;
    fVar173 = fVar153 * 0.0 + fVar173 * 0.0;
    fVar153 = fVar152 - fVar93;
    if (fVar153 < 0.16666667) {
      fVar246 = 1.0 - fVar91;
      fVar249 = 1.0 - fVar91;
      fVar252 = 1.0 - fVar92;
      fVar258 = 1.0 - fVar92;
      fVar214 = fVar94 * fVar246 + fVar179 * fVar91;
      fVar222 = fVar117 * fVar249 + fVar201 * fVar91;
      fVar223 = fVar94 * fVar252 + fVar179 * fVar92;
      fVar224 = fVar117 * fVar258 + fVar201 * fVar92;
      fVar230 = fVar95 * fVar246 + fVar172 * fVar91;
      fVar231 = fVar118 * fVar249 + fVar132 * fVar91;
      fVar232 = fVar95 * fVar252 + fVar172 * fVar92;
      fVar243 = fVar118 * fVar258 + fVar132 * fVar92;
      fVar261 = fVar177 * fVar246 + fVar154 * fVar91;
      fVar264 = fVar178 * fVar249 + fVar171 * fVar91;
      fVar271 = fVar177 * fVar252 + fVar154 * fVar92;
      fVar276 = fVar178 * fVar258 + fVar171 * fVar92;
      fVar250 = (fVar246 * fVar202 + fVar91 * fVar131) - fVar261;
      fVar251 = (fVar249 * fVar203 + fVar91 * fVar51) - fVar264;
      fVar253 = (fVar252 * fVar202 + fVar92 * fVar131) - fVar271;
      fVar259 = (fVar258 * fVar203 + fVar92 * fVar51) - fVar276;
      fVar260 = fVar93 * (fVar261 - fVar230) + fVar230;
      fVar262 = fVar93 * (fVar264 - fVar231) + fVar231;
      fVar233 = fVar93 * (fVar271 - fVar232) + fVar232;
      fVar234 = fVar93 * (fVar276 - fVar243) + fVar243;
      fVar263 = (fVar261 - fVar230) * fVar152 + fVar230;
      fVar269 = (fVar264 - fVar231) * fVar152 + fVar231;
      fVar272 = (fVar271 - fVar232) * fVar152 + fVar232;
      fVar278 = (fVar276 - fVar243) * fVar152 + fVar243;
      fVar246 = fVar93 * (fVar230 - fVar214) + fVar214;
      fVar249 = fVar93 * (fVar231 - fVar222) + fVar222;
      fVar252 = fVar93 * (fVar232 - fVar223) + fVar223;
      fVar258 = fVar93 * (fVar243 - fVar224) + fVar224;
      fVar246 = (fVar260 - fVar246) * fVar93 + fVar246;
      fVar249 = (fVar262 - fVar249) * fVar93 + fVar249;
      fVar252 = (fVar233 - fVar252) * fVar93 + fVar252;
      fVar258 = (fVar234 - fVar258) * fVar93 + fVar258;
      fVar244 = (((fVar93 * fVar250 + fVar261) - fVar260) * fVar93 + fVar260) - fVar246;
      fVar245 = (((fVar93 * fVar251 + fVar264) - fVar262) * fVar93 + fVar262) - fVar249;
      fVar247 = (((fVar93 * fVar253 + fVar271) - fVar233) * fVar93 + fVar233) - fVar252;
      fVar248 = (((fVar93 * fVar259 + fVar276) - fVar234) * fVar93 + fVar234) - fVar258;
      fVar246 = fVar93 * fVar244 + fVar246;
      fVar249 = fVar93 * fVar245 + fVar249;
      fVar252 = fVar93 * fVar247 + fVar252;
      fVar258 = fVar93 * fVar248 + fVar258;
      auVar107._0_4_ = (fVar230 - fVar214) * fVar152 + fVar214;
      auVar107._4_4_ = (fVar231 - fVar222) * fVar152 + fVar222;
      auVar107._8_4_ = (fVar232 - fVar223) * fVar152 + fVar223;
      auVar107._12_4_ = (fVar243 - fVar224) * fVar152 + fVar224;
      fVar260 = (fVar263 - auVar107._0_4_) * fVar152 + auVar107._0_4_;
      fVar262 = (fVar269 - auVar107._4_4_) * fVar152 + auVar107._4_4_;
      fVar233 = (fVar272 - auVar107._8_4_) * fVar152 + auVar107._8_4_;
      fVar234 = (fVar278 - auVar107._12_4_) * fVar152 + auVar107._12_4_;
      fVar222 = (((fVar250 * fVar152 + fVar261) - fVar263) * fVar152 + fVar263) - fVar260;
      fVar223 = (((fVar251 * fVar152 + fVar264) - fVar269) * fVar152 + fVar269) - fVar262;
      fVar224 = (((fVar253 * fVar152 + fVar271) - fVar272) * fVar152 + fVar272) - fVar233;
      fVar230 = (((fVar259 * fVar152 + fVar276) - fVar278) * fVar152 + fVar278) - fVar234;
      fVar260 = fVar152 * fVar222 + fVar260;
      fVar262 = fVar152 * fVar223 + fVar262;
      fVar233 = fVar152 * fVar224 + fVar233;
      fVar234 = fVar152 * fVar230 + fVar234;
      fVar214 = fVar153 * 0.33333334;
      fVar244 = fVar244 * 3.0 * fVar214 + fVar246;
      fVar245 = fVar245 * 3.0 * fVar214 + fVar249;
      fVar247 = fVar247 * 3.0 * fVar214 + fVar252;
      fVar248 = fVar248 * 3.0 * fVar214 + fVar258;
      fVar250 = fVar260 - fVar214 * fVar222 * 3.0;
      fVar251 = fVar262 - fVar214 * fVar223 * 3.0;
      fVar253 = fVar233 - fVar214 * fVar224 * 3.0;
      fVar259 = fVar234 - fVar214 * fVar230 * 3.0;
      auVar12._4_8_ = auVar107._8_8_;
      auVar12._0_4_ = fVar249;
      auVar108._0_8_ = auVar12._0_8_ << 0x20;
      auVar108._8_4_ = fVar252;
      auVar108._12_4_ = fVar258;
      local_528 = (undefined1  [8])auVar108._8_8_;
      fVar230 = (fVar233 - fVar260) + (fVar252 - fVar246);
      fVar231 = (fVar234 - fVar262) + (fVar258 - fVar249);
      auVar217._0_4_ = fVar251 * fVar231;
      auVar217._4_4_ = fVar251 * fVar231;
      auVar217._8_4_ = fVar259 * fVar231;
      auVar217._12_4_ = fVar259 * fVar231;
      fVar214 = fVar246 * fVar230 + fVar249 * fVar231;
      fVar222 = fVar252 * fVar230 + fVar258 * fVar231;
      fVar232 = fVar244 * fVar230 + fVar245 * fVar231;
      fVar243 = fVar247 * fVar230 + fVar248 * fVar231;
      fVar261 = fVar250 * fVar230 + auVar217._0_4_;
      auVar196._0_8_ = CONCAT44(fVar251 * fVar230 + auVar217._4_4_,fVar261);
      auVar196._8_4_ = fVar253 * fVar230 + auVar217._8_4_;
      auVar196._12_4_ = fVar259 * fVar230 + auVar217._12_4_;
      fVar224 = fVar230 * fVar260 + fVar231 * fVar262;
      fVar263 = fVar230 * fVar233 + fVar231 * fVar234;
      auVar13._4_8_ = auVar217._8_8_;
      auVar13._0_4_ = fVar245 * fVar230 + fVar245 * fVar231;
      auVar218._0_8_ = auVar13._0_8_ << 0x20;
      auVar218._8_4_ = fVar243;
      auVar218._12_4_ = fVar248 * fVar230 + fVar248 * fVar231;
      fVar223 = fVar232;
      if (fVar232 <= fVar214) {
        fVar223 = fVar214;
        fVar214 = fVar232;
      }
      auVar219._8_8_ = auVar218._8_8_;
      auVar219._0_8_ = auVar219._8_8_;
      auVar78._8_4_ = auVar196._8_4_;
      auVar78._0_8_ = auVar196._0_8_;
      auVar78._12_4_ = auVar196._12_4_;
      if (fVar224 <= fVar261) {
        auVar78._0_4_ = fVar224;
      }
      if (auVar78._0_4_ <= fVar214) {
        fVar214 = auVar78._0_4_;
      }
      auVar14._4_8_ = auVar78._8_8_;
      auVar14._0_4_ = fVar230 * fVar262 + fVar231 * fVar262;
      auVar79._0_8_ = auVar14._0_8_ << 0x20;
      auVar79._8_4_ = fVar263;
      auVar79._12_4_ = fVar230 * fVar234 + fVar231 * fVar234;
      if (fVar224 <= fVar261) {
        fVar224 = fVar261;
      }
      auVar80._8_8_ = auVar79._8_8_;
      auVar80._0_8_ = auVar80._8_8_;
      if (fVar224 <= fVar223) {
        fVar224 = fVar223;
      }
      if (fVar243 <= fVar222) {
        auVar219._0_4_ = fVar222;
        fVar222 = fVar243;
      }
      auVar109._8_4_ = auVar196._8_4_;
      auVar109._0_8_ = auVar196._8_8_;
      auVar109._12_4_ = auVar196._12_4_;
      if (fVar263 <= auVar196._8_4_) {
        auVar109._0_4_ = fVar263;
      }
      if (auVar109._0_4_ <= fVar222) {
        fVar222 = auVar109._0_4_;
      }
      if (fVar263 <= auVar196._8_4_) {
        auVar80._0_4_ = auVar196._8_4_;
      }
      if (auVar80._0_4_ <= auVar219._0_4_) {
        auVar80._0_4_ = auVar219._0_4_;
      }
      uVar43 = CONCAT71((int7)(uVar43 >> 8),fVar153 < 0.001);
      fVar223 = auVar80._0_4_;
      if ((0.0001 <= fVar214) || (fVar223 <= -0.0001)) break;
      goto LAB_00a75f7c;
    }
  } while( true );
  if ((fVar222 < 0.0001 && -0.0001 < fVar224) ||
     ((fVar214 < 0.0001 && -0.0001 < fVar224 || (fVar222 < 0.0001 && -0.0001 < fVar223)))) {
LAB_00a75f7c:
    fVar231 = (float)(~-(uint)(fVar214 < 0.0) & 0x3f800000 | -(uint)(fVar214 < 0.0) & 0xbf800000);
    fVar232 = (float)(~-(uint)(fVar224 < 0.0) & 0x3f800000 | -(uint)(fVar224 < 0.0) & 0xbf800000);
    fVar230 = 0.0;
    if ((fVar231 == fVar232) && (!NAN(fVar231) && !NAN(fVar232))) {
      fVar230 = INFINITY;
    }
    fVar243 = 0.0;
    if ((fVar231 == fVar232) && (!NAN(fVar231) && !NAN(fVar232))) {
      fVar243 = -INFINITY;
    }
    fVar261 = (float)(~-(uint)(fVar222 < 0.0) & 0x3f800000 | -(uint)(fVar222 < 0.0) & 0xbf800000);
    if ((fVar231 != fVar261) || (fVar263 = fVar243, NAN(fVar231) || NAN(fVar261))) {
      if ((fVar222 != fVar214) || (NAN(fVar222) || NAN(fVar214))) {
        fVar222 = -fVar214 / (fVar222 - fVar214);
        fVar222 = (1.0 - fVar222) * 0.0 + fVar222;
        fVar263 = fVar222;
      }
      else {
        fVar222 = 0.0;
        if ((fVar214 != 0.0) || (fVar263 = 1.0, NAN(fVar214))) {
          fVar222 = INFINITY;
          fVar263 = -INFINITY;
        }
      }
      if (fVar222 <= fVar230) {
        fVar230 = fVar222;
      }
      if (fVar263 <= fVar243) {
        fVar263 = fVar243;
      }
    }
    uVar43 = (ulong)(fVar223 < 0.0);
    fVar214 = *(float *)(&DAT_01f80eb4 + uVar43 * 4);
    if ((fVar232 != fVar214) || (fVar222 = fVar263, NAN(fVar232) || NAN(fVar214))) {
      if ((fVar223 != fVar224) || (NAN(fVar223) || NAN(fVar224))) {
        fVar231 = -fVar224 / (fVar223 - fVar224);
        fVar231 = (1.0 - fVar231) * 0.0 + fVar231;
        fVar222 = fVar231;
      }
      else {
        fVar231 = 0.0;
        if ((fVar224 != 0.0) || (fVar222 = 1.0, NAN(fVar224))) {
          fVar231 = INFINITY;
          fVar222 = -INFINITY;
        }
      }
      if (fVar231 <= fVar230) {
        fVar230 = fVar231;
      }
      if (fVar222 <= fVar263) {
        fVar222 = fVar263;
      }
    }
    if ((fVar261 != fVar214) || (NAN(fVar261) || NAN(fVar214))) {
      fVar230 = (float)(~-(uint)(fVar230 < 1.0) & 0x3f800000 |
                       (uint)fVar230 & -(uint)(fVar230 < 1.0));
      fVar222 = (float)(~-(uint)(fVar222 < 1.0) & (uint)fVar222 |
                       -(uint)(fVar222 < 1.0) & 0x3f800000);
    }
    fVar230 = (float)(~-(uint)(fVar230 < 0.0) & (uint)fVar230);
    fVar214 = (float)(~-(uint)(fVar222 < 1.0) & 0x3f800000 | (uint)fVar222 & -(uint)(fVar222 < 1.0))
    ;
    if (fVar230 <= fVar214) {
      fVar230 = fVar230 + -0.1;
      fVar214 = fVar214 + 0.1;
      uVar49 = -(uint)(fVar214 < 1.0);
      fVar230 = (float)(~-(uint)(fVar230 < 0.0) & (uint)fVar230);
      fVar214 = (float)(~uVar49 & 0x3f800000 | (uint)fVar214 & uVar49);
      fVar261 = 1.0 - fVar230;
      fVar263 = 1.0 - fVar230;
      fVar264 = 1.0 - fVar214;
      fVar269 = 1.0 - fVar214;
      fStack_520 = auVar60._8_4_;
      fStack_51c = auVar60._12_4_;
      fVar222 = fVar246 * fVar261 + fVar252 * fVar230;
      fVar224 = fVar249 * fVar263 + fVar258 * fVar230;
      fVar231 = fVar246 * fVar264 + fStack_520 * fVar214;
      fVar232 = fVar249 * fVar269 + fStack_51c * fVar214;
      fVar243 = fVar244 * fVar261 + fVar247 * fVar230;
      fVar246 = fVar245 * fVar263 + fVar248 * fVar230;
      fVar249 = fVar244 * fVar264 + fVar247 * fVar214;
      fVar252 = fVar245 * fVar269 + fVar248 * fVar214;
      fVar258 = fVar250 * fVar261 + fVar253 * fVar230;
      fVar244 = fVar251 * fVar263 + fVar259 * fVar230;
      fVar245 = fVar250 * fVar264 + fVar253 * fVar214;
      fVar247 = fVar251 * fVar269 + fVar259 * fVar214;
      fVar248 = fVar261 * fVar260 + fVar233 * fVar230;
      fVar250 = fVar263 * fVar262 + fVar234 * fVar230;
      fVar251 = fVar264 * fVar260 + fVar137 * fVar214;
      fVar262 = fVar269 * fVar262 + fVar213 * fVar214;
      fVar260 = fVar91 * (1.0 - fVar214);
      fVar91 = fVar91 * (1.0 - fVar230) + fVar92 * fVar230;
      fVar92 = fVar260 + fVar92 * fVar214;
      fVar260 = 1.0 / fVar153;
      auVar110._0_4_ = fVar251 - fVar248;
      auVar110._4_4_ = fVar262 - fVar250;
      auVar110._8_4_ = fVar251 - fVar251;
      auVar110._12_4_ = fVar262 - fVar262;
      auVar134._0_8_ = CONCAT44(fVar247 - fVar244,fVar245 - fVar258);
      auVar134._8_4_ = fVar245 - fVar245;
      auVar134._12_4_ = fVar247 - fVar247;
      auVar166._0_4_ = fVar249 - fVar243;
      auVar166._4_4_ = fVar252 - fVar246;
      auVar166._8_4_ = fVar249 - fVar249;
      auVar166._12_4_ = fVar252 - fVar252;
      auVar220._0_8_ = CONCAT44((fVar246 - fVar224) * 3.0,(fVar243 - fVar222) * 3.0);
      auVar220._8_4_ = (fVar249 - fVar231) * 3.0;
      auVar220._12_4_ = (fVar252 - fVar232) * 3.0;
      auVar148._0_8_ = CONCAT44((fVar244 - fVar246) * 3.0,(fVar258 - fVar243) * 3.0);
      auVar148._8_4_ = (fVar245 - fVar249) * 3.0;
      auVar148._12_4_ = (fVar247 - fVar252) * 3.0;
      auVar239._0_4_ = (fVar248 - fVar258) * 3.0;
      auVar239._4_4_ = (fVar250 - fVar244) * 3.0;
      auVar239._8_4_ = (fVar251 - fVar245) * 3.0;
      auVar239._12_4_ = (fVar262 - fVar247) * 3.0;
      auVar197._8_4_ = auVar148._8_4_;
      auVar197._0_8_ = auVar148._0_8_;
      auVar197._12_4_ = auVar148._12_4_;
      auVar160 = minps(auVar197,auVar239);
      auVar60 = maxps(auVar148,auVar239);
      auVar226._8_4_ = auVar220._8_4_;
      auVar226._0_8_ = auVar220._0_8_;
      auVar226._12_4_ = auVar220._12_4_;
      auVar123 = minps(auVar226,auVar160);
      auVar161 = maxps(auVar220,auVar60);
      auVar15._4_8_ = auVar60._8_8_;
      auVar15._0_4_ = auVar123._4_4_;
      auVar149._0_8_ = auVar15._0_8_ << 0x20;
      auVar149._8_4_ = auVar123._8_4_;
      auVar149._12_4_ = auVar123._12_4_;
      auVar150._8_8_ = auVar123._8_8_;
      auVar150._0_8_ = auVar149._8_8_;
      auVar16._4_8_ = auVar160._8_8_;
      auVar16._0_4_ = auVar161._4_4_;
      auVar198._0_8_ = auVar16._0_8_ << 0x20;
      auVar198._8_4_ = auVar161._8_4_;
      auVar198._12_4_ = auVar161._12_4_;
      auVar199._8_8_ = auVar161._8_8_;
      auVar199._0_8_ = auVar198._8_8_;
      auVar160 = minps(auVar123,auVar150);
      auVar60 = maxps(auVar161,auVar199);
      fVar263 = auVar160._0_4_ * fVar260;
      fVar264 = auVar160._4_4_ * fVar260;
      fVar269 = auVar160._8_4_ * fVar260;
      fVar271 = auVar160._12_4_ * fVar260;
      fVar262 = fVar260 * auVar60._0_4_;
      fVar244 = fVar260 * auVar60._4_4_;
      fVar247 = fVar260 * auVar60._8_4_;
      fVar260 = fVar260 * auVar60._12_4_;
      fVar259 = 1.0 / (fVar92 - fVar91);
      auVar81._0_8_ = CONCAT44(fVar232 - fVar224,fVar231 - fVar222);
      auVar81._8_4_ = fVar231 - fVar231;
      auVar81._12_4_ = fVar232 - fVar232;
      auVar207._8_4_ = auVar81._8_4_;
      auVar207._0_8_ = auVar81._0_8_;
      auVar207._12_4_ = auVar81._12_4_;
      auVar161 = minps(auVar207,auVar166);
      auVar60 = maxps(auVar81,auVar166);
      auVar129._8_4_ = auVar134._8_4_;
      auVar129._0_8_ = auVar134._0_8_;
      auVar129._12_4_ = auVar134._12_4_;
      auVar160 = minps(auVar129,auVar110);
      auVar161 = minps(auVar161,auVar160);
      auVar160 = maxps(auVar134,auVar110);
      auVar60 = maxps(auVar60,auVar160);
      fVar251 = auVar161._0_4_ * fVar259;
      fVar253 = auVar161._4_4_ * fVar259;
      fVar261 = fVar259 * auVar60._0_4_;
      fVar259 = fVar259 * auVar60._4_4_;
      local_528._4_4_ = fVar91;
      local_528._0_4_ = fVar93;
      fStack_520 = fVar152;
      fStack_51c = fVar92;
      auVar200._4_4_ = fVar92;
      auVar200._0_4_ = fVar152;
      auVar200._8_4_ = fVar212;
      auVar200._12_4_ = fVar173;
      local_b8 = (fVar93 + fVar152) * 0.5;
      fVar249 = (fVar91 + fVar92) * 0.5;
      fVar252 = (fVar152 + fVar212) * 0.0;
      fVar258 = (fVar92 + fVar173) * 0.0;
      fVar214 = local_128 * local_b8 + (float)local_348;
      fVar222 = fStack_124 * local_b8 + local_348._4_4_;
      fVar224 = fStack_120 * local_b8 + fStack_340;
      fVar230 = fStack_11c * local_b8 + fStack_33c;
      fVar231 = local_138 * local_b8 + fVar154;
      fVar232 = fStack_134 * local_b8 + fVar171;
      fVar243 = fStack_130 * local_b8 + fVar172;
      fVar246 = fStack_12c * local_b8 + fVar132;
      fVar214 = (fVar231 - fVar214) * local_b8 + fVar214;
      fVar222 = (fVar232 - fVar222) * local_b8 + fVar222;
      fVar224 = (fVar243 - fVar224) * local_b8 + fVar224;
      fVar230 = (fVar246 - fVar230) * local_b8 + fVar230;
      fVar231 = (((local_148 * local_b8 + fVar177) - fVar231) * local_b8 + fVar231) - fVar214;
      fVar232 = (((fStack_144 * local_b8 + fVar178) - fVar232) * local_b8 + fVar232) - fVar222;
      fVar243 = (((fStack_140 * local_b8 + fStack_420) - fVar243) * local_b8 + fVar243) - fVar224;
      fVar246 = (((fStack_13c * local_b8 + fStack_41c) - fVar246) * local_b8 + fVar246) - fVar230;
      fVar214 = local_b8 * fVar231 + fVar214;
      fVar222 = local_b8 * fVar232 + fVar222;
      fVar231 = fVar231 * 3.0;
      fVar232 = fVar232 * 3.0;
      fVar224 = (local_b8 * fVar243 + fVar224) - fVar214;
      fVar230 = (local_b8 * fVar246 + fVar230) - fVar222;
      fVar231 = (fVar243 * 3.0 - fVar231) * fVar249 + fVar231;
      fVar232 = (fVar246 * 3.0 - fVar232) * fVar249 + fVar232;
      auVar135._0_8_ = CONCAT44(fVar231,fVar224) ^ 0x80000000;
      auVar135._8_4_ = fVar231;
      auVar135._12_4_ = fVar231;
      fVar272 = fVar93 - local_b8;
      fVar276 = fVar91 - fVar249;
      fVar278 = fVar152 - fVar252;
      fVar279 = fVar92 - fVar258;
      fVar265 = fVar152 - local_b8;
      fVar270 = fVar92 - fVar249;
      fVar212 = fVar212 - fVar252;
      fVar173 = fVar173 - fVar258;
      fVar214 = fVar224 * fVar249 + fVar214;
      fVar222 = fVar230 * fVar249 + fVar222;
      auVar151._0_8_ = CONCAT44(fVar232,fVar230) ^ 0x8000000000000000;
      auVar151._8_4_ = -fVar232;
      auVar151._12_4_ = -fVar232;
      auVar82._0_4_ = fVar230 * fVar231 - fVar232 * fVar224;
      auVar82._4_4_ = auVar82._0_4_;
      auVar82._8_4_ = auVar82._0_4_;
      auVar82._12_4_ = auVar82._0_4_;
      auVar160 = divps(auVar151,auVar82);
      auVar60 = divps(auVar135,auVar82);
      fVar246 = auVar160._0_4_;
      fVar252 = auVar160._4_4_;
      fVar232 = auVar60._0_4_;
      fVar243 = auVar60._4_4_;
      local_b8 = local_b8 - (fVar222 * fVar232 + fVar214 * fVar246);
      local_a8 = fVar249 - (fVar222 * fVar243 + fVar214 * fVar252);
      fVar231 = fVar249 - (fVar222 * auVar60._8_4_ + fVar214 * auVar160._8_4_);
      fVar249 = fVar249 - (fVar222 * auVar60._12_4_ + fVar214 * auVar160._12_4_);
      auVar111._0_8_ = CONCAT44(fVar252 * fVar251,fVar252 * fVar263);
      auVar111._8_4_ = fVar252 * fVar264;
      auVar111._12_4_ = fVar252 * fVar253;
      auVar83._0_4_ = fVar252 * fVar262;
      auVar83._4_4_ = fVar252 * fVar261;
      auVar83._8_4_ = fVar252 * fVar244;
      auVar83._12_4_ = fVar252 * fVar259;
      auVar277._8_4_ = auVar111._8_4_;
      auVar277._0_8_ = auVar111._0_8_;
      auVar277._12_4_ = auVar111._12_4_;
      auVar123 = minps(auVar277,auVar83);
      auVar60 = maxps(auVar83,auVar111);
      auVar167._0_8_ = CONCAT44(fVar243 * fVar253,fVar243 * fVar264);
      auVar167._8_4_ = fVar243 * fVar269;
      auVar167._12_4_ = fVar243 * fVar271;
      auVar112._0_4_ = fVar243 * fVar244;
      auVar112._4_4_ = fVar243 * fVar259;
      auVar112._8_4_ = fVar243 * fVar247;
      auVar112._12_4_ = fVar243 * fVar260;
      auVar227._8_4_ = auVar167._8_4_;
      auVar227._0_8_ = auVar167._0_8_;
      auVar227._12_4_ = auVar167._12_4_;
      auVar161 = minps(auVar227,auVar112);
      auVar160 = maxps(auVar112,auVar167);
      fVar214 = 0.0 - (auVar160._0_4_ + auVar60._0_4_);
      fVar222 = 1.0 - (auVar160._4_4_ + auVar60._4_4_);
      fVar224 = 0.0 - (auVar160._8_4_ + auVar60._8_4_);
      fVar230 = 0.0 - (auVar160._12_4_ + auVar60._12_4_);
      fVar258 = 0.0 - (auVar161._0_4_ + auVar123._0_4_);
      fVar245 = 1.0 - (auVar161._4_4_ + auVar123._4_4_);
      fVar248 = 0.0 - (auVar161._8_4_ + auVar123._8_4_);
      fVar250 = 0.0 - (auVar161._12_4_ + auVar123._12_4_);
      auVar113._0_8_ = CONCAT44(fVar276 * fVar222,fVar272 * fVar214);
      auVar113._8_4_ = fVar278 * fVar224;
      auVar113._12_4_ = fVar279 * fVar230;
      auVar240._0_8_ = CONCAT44(fVar251 * fVar246,fVar263 * fVar246);
      auVar240._8_4_ = fVar264 * fVar246;
      auVar240._12_4_ = fVar253 * fVar246;
      auVar168._0_4_ = fVar246 * fVar262;
      auVar168._4_4_ = fVar246 * fVar261;
      auVar168._8_4_ = fVar246 * fVar244;
      auVar168._12_4_ = fVar246 * fVar259;
      auVar228._8_4_ = auVar240._8_4_;
      auVar228._0_8_ = auVar240._0_8_;
      auVar228._12_4_ = auVar240._12_4_;
      auVar160 = minps(auVar228,auVar168);
      auVar60 = maxps(auVar168,auVar240);
      auVar208._0_8_ = CONCAT44(fVar253 * fVar232,fVar264 * fVar232);
      auVar208._8_4_ = fVar269 * fVar232;
      auVar208._12_4_ = fVar271 * fVar232;
      auVar241._0_4_ = fVar232 * fVar244;
      auVar241._4_4_ = fVar232 * fVar259;
      auVar241._8_4_ = fVar232 * fVar247;
      auVar241._12_4_ = fVar232 * fVar260;
      auVar275._8_4_ = auVar208._8_4_;
      auVar275._0_8_ = auVar208._0_8_;
      auVar275._12_4_ = auVar208._12_4_;
      auVar123 = minps(auVar275,auVar241);
      auVar229._0_4_ = fVar272 * fVar258;
      auVar229._4_4_ = fVar276 * fVar245;
      auVar229._8_4_ = fVar278 * fVar248;
      auVar229._12_4_ = fVar279 * fVar250;
      auVar84._0_8_ = CONCAT44(fVar222 * fVar270,fVar214 * fVar265);
      auVar84._8_4_ = fVar224 * fVar212;
      auVar84._12_4_ = fVar230 * fVar173;
      auVar176._0_4_ = fVar258 * fVar265;
      auVar176._4_4_ = fVar245 * fVar270;
      auVar176._8_4_ = fVar248 * fVar212;
      auVar176._12_4_ = fVar250 * fVar173;
      auVar161 = maxps(auVar241,auVar208);
      fVar214 = 1.0 - (auVar161._0_4_ + auVar60._0_4_);
      fVar222 = 0.0 - (auVar161._4_4_ + auVar60._4_4_);
      fVar224 = 0.0 - (auVar161._8_4_ + auVar60._8_4_);
      fVar230 = 0.0 - (auVar161._12_4_ + auVar60._12_4_);
      fVar258 = 1.0 - (auVar123._0_4_ + auVar160._0_4_);
      fVar260 = 0.0 - (auVar123._4_4_ + auVar160._4_4_);
      fVar262 = 0.0 - (auVar123._8_4_ + auVar160._8_4_);
      fVar244 = 0.0 - (auVar123._12_4_ + auVar160._12_4_);
      auVar209._0_8_ = CONCAT44(fVar276 * fVar222,fVar272 * fVar214);
      auVar209._8_4_ = fVar278 * fVar224;
      auVar209._12_4_ = fVar279 * fVar230;
      auVar257._0_4_ = fVar272 * fVar258;
      auVar257._4_4_ = fVar276 * fVar260;
      auVar257._8_4_ = fVar278 * fVar262;
      auVar257._12_4_ = fVar279 * fVar244;
      auVar169._0_8_ = CONCAT44(fVar222 * fVar270,fVar214 * fVar265);
      auVar169._8_4_ = fVar224 * fVar212;
      auVar169._12_4_ = fVar230 * fVar173;
      auVar221._0_4_ = fVar258 * fVar265;
      auVar221._4_4_ = fVar260 * fVar270;
      auVar221._8_4_ = fVar262 * fVar212;
      auVar221._12_4_ = fVar244 * fVar173;
      auVar242._8_4_ = auVar209._8_4_;
      auVar242._0_8_ = auVar209._0_8_;
      auVar242._12_4_ = auVar209._12_4_;
      auVar60 = minps(auVar242,auVar257);
      auVar268._8_4_ = auVar169._8_4_;
      auVar268._0_8_ = auVar169._0_8_;
      auVar268._12_4_ = auVar169._12_4_;
      auVar160 = minps(auVar268,auVar221);
      auVar216 = minps(auVar60,auVar160);
      auVar160 = maxps(auVar257,auVar209);
      auVar60 = maxps(auVar221,auVar169);
      auVar161 = maxps(auVar60,auVar160);
      auVar210._8_4_ = auVar113._8_4_;
      auVar210._0_8_ = auVar113._0_8_;
      auVar210._12_4_ = auVar113._12_4_;
      auVar160 = minps(auVar210,auVar229);
      auVar170._8_4_ = auVar84._8_4_;
      auVar170._0_8_ = auVar84._0_8_;
      auVar170._12_4_ = auVar84._12_4_;
      auVar60 = minps(auVar170,auVar176);
      auVar160 = minps(auVar160,auVar60);
      auVar123 = maxps(auVar229,auVar113);
      auVar60 = maxps(auVar176,auVar84);
      auVar60 = maxps(auVar60,auVar123);
      auVar211._0_4_ = auVar216._4_4_ + auVar216._0_4_ + local_b8;
      auVar211._4_4_ = auVar160._4_4_ + auVar160._0_4_ + local_a8;
      auVar211._8_4_ = auVar216._8_4_ + auVar216._4_4_ + fVar231;
      auVar211._12_4_ = auVar216._12_4_ + auVar160._4_4_ + fVar249;
      fVar173 = auVar161._4_4_ + auVar161._0_4_ + local_b8;
      fVar212 = auVar60._4_4_ + auVar60._0_4_ + local_a8;
      auVar85._4_4_ = fVar212;
      auVar85._0_4_ = fVar173;
      auVar160 = maxps(_local_528,auVar211);
      auVar85._8_4_ = auVar161._8_4_ + auVar161._4_4_ + fVar231;
      auVar85._12_4_ = auVar161._12_4_ + auVar60._4_4_ + fVar249;
      auVar60 = minps(auVar85,auVar200);
      iVar35 = -(uint)(auVar60._0_4_ < auVar160._0_4_);
      iVar47 = -(uint)(auVar60._4_4_ < auVar160._4_4_);
      auVar87._4_4_ = iVar47;
      auVar87._0_4_ = iVar35;
      auVar87._8_4_ = iVar47;
      auVar87._12_4_ = iVar47;
      auVar86._8_8_ = auVar87._8_8_;
      auVar86._4_4_ = iVar35;
      auVar86._0_4_ = iVar35;
      uVar49 = movmskpd((uint)(fVar223 < 0.0),auVar86);
      uVar43 = (ulong)uVar49;
      if (uVar49 == 0) {
        uVar43 = 0;
        if ((fVar93 < auVar211._0_4_) && (fVar173 < fVar152)) {
          iVar35 = -(uint)(fVar212 < fVar92);
          uVar43 = (ulong)CONCAT11((char)((uint)iVar35 >> 8),(byte)iVar35 & fVar91 < auVar211._4_4_)
          ;
        }
        bVar34 = (3 < uVar46 || fVar153 < 0.001) | (byte)uVar43;
        uVar37 = (ulong)CONCAT31((int3)(uVar48 >> 8),bVar34);
        if (bVar34 != 1) goto LAB_00a7559f;
        lVar38 = 200;
        do {
          fVar92 = 1.0 - local_b8;
          fVar153 = local_b8 * local_b8 * local_b8;
          fVar152 = local_b8 * local_b8 * 3.0 * fVar92;
          fVar91 = fVar92 * fVar92 * fVar92;
          fVar173 = local_b8 * 3.0 * fVar92 * fVar92;
          fVar92 = fVar91 * (float)local_348 +
                   fVar173 * fVar154 + fVar152 * fVar177 + fVar153 * fVar202;
          fVar93 = fVar91 * local_348._4_4_ +
                   fVar173 * fVar171 + fVar152 * fVar178 + fVar153 * fVar203;
          fVar92 = ((fVar91 * fStack_340 +
                    fVar173 * fVar172 + fVar152 * fStack_420 + fVar153 * fVar131) - fVar92) *
                   local_a8 + fVar92;
          fVar93 = ((fVar91 * fStack_33c +
                    fVar173 * fVar132 + fVar152 * fStack_41c + fVar153 * fVar51) - fVar93) *
                   local_a8 + fVar93;
          local_b8 = local_b8 - (fVar93 * fVar232 + fVar92 * fVar246);
          local_a8 = local_a8 - (fVar93 * fVar243 + fVar92 * fVar252);
          fVar91 = ABS(fVar93);
          if (ABS(fVar93) <= ABS(fVar92)) {
            fVar91 = ABS(fVar92);
          }
          if (fVar91 < local_118) {
            if ((((0.0 <= local_b8) && (local_b8 <= 1.0)) && (0.0 <= local_a8)) && (local_a8 <= 1.0)
               ) {
              fVar91 = pre->ray_space[k].vx.field_0.m128[2];
              fVar92 = pre->ray_space[k].vy.field_0.m128[2];
              fVar93 = pre->ray_space[k].vz.field_0.m128[2];
              fVar222 = 1.0 - local_a8;
              fVar214 = 1.0 - local_b8;
              fVar152 = fVar214 * fVar214 * fVar214;
              fVar153 = local_b8 * 3.0 * fVar214 * fVar214;
              fVar212 = local_b8 * local_b8 * local_b8;
              fVar173 = local_b8 * local_b8 * 3.0 * fVar214;
              fVar91 = ((fStack_150 * fVar93 + fStack_154 * fVar92 + local_158 * fVar91) * fVar222 +
                       (fStack_190 * fVar93 + fStack_194 * fVar92 + local_198 * fVar91) * local_a8)
                       * fVar152 +
                       ((fStack_160 * fVar93 + fStack_164 * fVar92 + local_168 * fVar91) * fVar222 +
                       (fStack_1a0 * fVar93 + fStack_1a4 * fVar92 + local_1a8 * fVar91) * local_a8)
                       * fVar153 +
                       ((fStack_170 * fVar93 + fStack_174 * fVar92 + local_178 * fVar91) * fVar222 +
                       (fStack_1b0 * fVar93 + fStack_1b4 * fVar92 + local_1b8 * fVar91) * local_a8)
                       * fVar173 +
                       (fVar222 * (fStack_180 * fVar93 + fStack_184 * fVar92 + local_188 * fVar91) +
                       (fVar93 * fStack_1c0 + fVar92 * fStack_1c4 + fVar91 * local_1c8) * local_a8)
                       * fVar212;
              if ((fVar52 <= fVar91) && (fVar92 = *(float *)(ray + k * 4 + 0x80), fVar91 <= fVar92))
              {
                fVar224 = 1.0 - local_a8;
                fVar230 = 1.0 - local_a8;
                fVar231 = 1.0 - local_a8;
                fVar93 = local_3b8 * fVar224 + local_288 * local_a8;
                fVar222 = fStack_3b4 * fVar230 + fStack_284 * local_a8;
                fVar223 = fStack_3b0 * fVar231 + fStack_280 * local_a8;
                fVar232 = local_3d8 * fVar224 + fVar233 * local_a8;
                fVar246 = fStack_3d4 * fVar230 + fVar234 * local_a8;
                fVar252 = fStack_3d0 * fVar231 + fVar136 * local_a8;
                fVar243 = fVar232 - fVar93;
                fVar249 = fVar246 - fVar222;
                fVar258 = fVar252 - fVar223;
                fVar93 = (((fVar93 - (local_3a8 * fVar224 + local_398 * local_a8)) * fVar214 +
                          local_b8 * fVar243) * fVar214 +
                         (fVar243 * fVar214 +
                         ((fVar224 * local_3c8 + fVar119 * local_a8) - fVar232) * local_b8) *
                         local_b8) * 3.0;
                fVar222 = (((fVar222 - (fStack_3a4 * fVar230 + fStack_394 * local_a8)) * fVar214 +
                           local_b8 * fVar249) * fVar214 +
                          (fVar249 * fVar214 +
                          ((fVar230 * fStack_3c4 + fVar130 * local_a8) - fVar246) * local_b8) *
                          local_b8) * 3.0;
                fVar214 = (((fVar223 - (fStack_3a0 * fVar231 + fStack_390 * local_a8)) * fVar214 +
                           local_b8 * fVar258) * fVar214 +
                          (fVar258 * fVar214 +
                          ((fVar231 * fStack_3c0 + fVar138 * local_a8) - fVar252) * local_b8) *
                          local_b8) * 3.0;
                pGVar7 = (context->scene->geometries).items[local_3e8].ptr;
                if ((pGVar7->mask & *(uint *)(ray + k * 4 + 0x90)) == 0) {
                  bVar44 = false;
                }
                else if ((context->args->filter != (RTCFilterFunctionN)0x0) ||
                        (bVar44 = true, pGVar7->occlusionFilterN != (RTCFilterFunctionN)0x0)) {
                  fVar223 = fVar152 * local_2a8 +
                            fVar153 * local_2b8 + fVar173 * local_2c8 + fVar212 * local_2d8;
                  fVar224 = fVar152 * fStack_2a4 +
                            fVar153 * fStack_2b4 + fVar173 * fStack_2c4 + fVar212 * fStack_2d4;
                  fVar152 = fVar152 * fStack_2a0 +
                            fVar153 * fStack_2b0 + fVar173 * fStack_2c0 + fVar212 * fStack_2d0;
                  local_c8 = fVar224 * fVar93 - fVar222 * fVar223;
                  local_e8 = fVar152 * fVar222 - fVar214 * fVar224;
                  local_d8 = fVar223 * fVar214 - fVar93 * fVar152;
                  fStack_e4 = local_e8;
                  fStack_e0 = local_e8;
                  fStack_dc = local_e8;
                  fStack_d4 = local_d8;
                  fStack_d0 = local_d8;
                  fStack_cc = local_d8;
                  fStack_c4 = local_c8;
                  fStack_c0 = local_c8;
                  fStack_bc = local_c8;
                  fStack_b4 = local_b8;
                  fStack_b0 = local_b8;
                  fStack_ac = local_b8;
                  fStack_a4 = local_a8;
                  fStack_a0 = local_a8;
                  fStack_9c = local_a8;
                  local_98 = CONCAT44(uStack_2f4,local_2f8);
                  uStack_90 = CONCAT44(uStack_2ec,uStack_2f0);
                  local_88 = CONCAT44(uStack_2e4,local_2e8);
                  uStack_80 = CONCAT44(uStack_2dc,uStack_2e0);
                  local_78 = context->user->instID[0];
                  uStack_74 = local_78;
                  uStack_70 = local_78;
                  uStack_6c = local_78;
                  local_68 = context->user->instPrimID[0];
                  uStack_64 = local_68;
                  uStack_60 = local_68;
                  uStack_5c = local_68;
                  *(float *)(ray + k * 4 + 0x80) = fVar91;
                  local_408 = *local_3f0;
                  local_328.valid = (int *)local_408;
                  local_328.geometryUserPtr = pGVar7->userPtr;
                  local_328.context = context->user;
                  local_328.ray = (RTCRayN *)ray;
                  local_328.hit = (RTCHitN *)&local_e8;
                  local_328.N = 4;
                  p_Var39 = pGVar7->occlusionFilterN;
                  if (p_Var39 != (RTCFilterFunctionN)0x0) {
                    p_Var39 = (RTCFilterFunctionN)(*p_Var39)(&local_328);
                  }
                  auVar114._0_4_ = -(uint)(local_408._0_4_ == 0);
                  auVar114._4_4_ = -(uint)(local_408._4_4_ == 0);
                  auVar114._8_4_ = -(uint)(local_408._8_4_ == 0);
                  auVar114._12_4_ = -(uint)(local_408._12_4_ == 0);
                  uVar48 = movmskps((int)p_Var39,auVar114);
                  pRVar40 = (RTCRayN *)(ulong)(uVar48 ^ 0xf);
                  if ((uVar48 ^ 0xf) == 0) {
                    auVar114 = auVar114 ^ _DAT_01f7ae20;
                  }
                  else {
                    p_Var39 = context->args->filter;
                    if ((p_Var39 != (RTCFilterFunctionN)0x0) &&
                       (((context->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                         RTC_RAY_QUERY_FLAG_INCOHERENT ||
                        (((pGVar7->field_8).field_0x2 & 0x40) != 0)))) {
                      (*p_Var39)(&local_328);
                    }
                    auVar88._0_4_ = -(uint)(local_408._0_4_ == 0);
                    auVar88._4_4_ = -(uint)(local_408._4_4_ == 0);
                    auVar88._8_4_ = -(uint)(local_408._8_4_ == 0);
                    auVar88._12_4_ = -(uint)(local_408._12_4_ == 0);
                    auVar114 = auVar88 ^ _DAT_01f7ae20;
                    *(undefined1 (*) [16])(local_328.ray + 0x80) =
                         ~auVar88 & _DAT_01f7aa00 |
                         *(undefined1 (*) [16])(local_328.ray + 0x80) & auVar88;
                    pRVar40 = local_328.ray;
                  }
                  auVar115._0_4_ = auVar114._0_4_ << 0x1f;
                  auVar115._4_4_ = auVar114._4_4_ << 0x1f;
                  auVar115._8_4_ = auVar114._8_4_ << 0x1f;
                  auVar115._12_4_ = auVar114._12_4_ << 0x1f;
                  iVar35 = movmskps((int)pRVar40,auVar115);
                  bVar44 = iVar35 != 0;
                  if (!bVar44) {
                    *(float *)(ray + k * 4 + 0x80) = fVar92;
                  }
                }
                local_53c = (uint)(byte)(bVar41 | bVar44);
                uVar43 = (ulong)local_53c;
              }
            }
            break;
          }
          lVar38 = lVar38 + -1;
        } while (lVar38 != 0);
      }
    }
  }
  goto LAB_00a75c20;
}

Assistant:

static __forceinline bool occluded_hn(Precalculations& pre, RayK<K>& ray, const size_t k, RayQueryContext* context, const Primitive& prim)
      {
        vfloat<M> tNear;
        vbool<M> valid = intersect(ray,k,prim,tNear);

        const size_t N = prim.N;
        size_t mask = movemask(valid);
        while (mask)
        {
          const size_t i = bscf(mask);
          STAT3(shadow.trav_prims,1,1,1);
          const unsigned int geomID = prim.geomID(N);
          const unsigned int primID = prim.primID(N)[i];
          const CurveGeometry* geom = context->scene->get<CurveGeometry>(geomID);
          Vec3ff p0,t0,p1,t1; Vec3fa n0,dn0,n1,dn1; geom->gather_hermite(p0,t0,n0,dn0,p1,t1,n1,dn1,geom->curve(primID));
          if (Intersector().intersect(pre,ray,k,context,geom,primID,p0,t0,p1,t1,n0,dn0,n1,dn1,Epilog(ray,k,context,geomID,primID)))
            return true;
          
          mask &= movemask(tNear <= vfloat<M>(ray.tfar[k]));
        }
        return false;
      }